

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_hn<embree::sse2::OrientedCurve1Intersector1<embree::HermiteCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined3 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined6 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  byte bVar58;
  ulong uVar59;
  ulong uVar60;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar61;
  ulong uVar62;
  int iVar63;
  RTCIntersectArguments *pRVar64;
  RTCIntersectArguments *pRVar65;
  long lVar66;
  ulong uVar67;
  undefined1 auVar68 [8];
  bool bVar69;
  uint uVar70;
  uint uVar71;
  int iVar72;
  uint uVar73;
  uint uVar74;
  short sVar75;
  float t1;
  undefined2 uVar104;
  float fVar76;
  float fVar105;
  float fVar106;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar126;
  float fVar127;
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  float fVar145;
  float fVar146;
  vfloat4 v;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar163;
  float fVar164;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar168;
  float fVar169;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar193;
  float fVar194;
  vfloat_impl<4> p00;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar205;
  float fVar206;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar219;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar258;
  float fVar261;
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar277;
  float fVar280;
  vfloat4 a;
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar296;
  float fVar299;
  vfloat4 a_2;
  float fVar302;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar303;
  float fVar304;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar305;
  float fVar306;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar311 [16];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar321;
  float fVar322;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar336;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar103;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar161 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  
  PVar13 = prim[1];
  uVar59 = (ulong)(byte)PVar13;
  lVar22 = uVar59 * 0x25;
  pPVar4 = prim + lVar22 + 6;
  fVar146 = *(float *)(pPVar4 + 0xc);
  fVar147 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar146;
  fVar163 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar146;
  fVar164 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar146;
  fVar128 = fVar146 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar145 = fVar146 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar146 = fVar146 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar14 = *(undefined4 *)(prim + uVar59 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar121._8_4_ = 0;
  auVar121._0_8_ = uVar60;
  auVar121._12_2_ = uVar104;
  auVar121._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar130._12_4_ = auVar121._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar60;
  auVar130._10_2_ = uVar104;
  auVar77._10_6_ = auVar130._10_6_;
  auVar77._8_2_ = uVar104;
  auVar77._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar36._4_8_ = auVar77._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  fVar321 = (float)((int)sVar75 >> 8);
  fVar326 = (float)(auVar36._0_4_ >> 0x18);
  fVar327 = (float)(auVar77._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar60;
  auVar110._12_2_ = uVar104;
  auVar110._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar60;
  auVar109._10_2_ = uVar104;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar104;
  auVar108._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar37._4_8_ = auVar108._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  fVar165 = (float)((int)sVar75 >> 8);
  fVar168 = (float)(auVar37._0_4_ >> 0x18);
  fVar169 = (float)(auVar108._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar60;
  auVar113._12_2_ = uVar104;
  auVar113._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar60;
  auVar112._10_2_ = uVar104;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar104;
  auVar111._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar38._4_8_ = auVar111._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  fVar195 = (float)((int)sVar75 >> 8);
  fVar205 = (float)(auVar38._0_4_ >> 0x18);
  fVar206 = (float)(auVar111._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 0xf + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar60;
  auVar116._12_2_ = uVar104;
  auVar116._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar60;
  auVar115._10_2_ = uVar104;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar104;
  auVar114._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar39._4_8_ = auVar114._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  fVar76 = (float)((int)sVar75 >> 8);
  fVar105 = (float)(auVar39._0_4_ >> 0x18);
  fVar106 = (float)(auVar114._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar60;
  auVar173._12_2_ = uVar104;
  auVar173._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar60;
  auVar172._10_2_ = uVar104;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar104;
  auVar171._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar40._4_8_ = auVar171._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  fVar207 = (float)((int)sVar75 >> 8);
  fVar216 = (float)(auVar40._0_4_ >> 0x18);
  fVar217 = (float)(auVar171._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar59 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar60;
  auVar176._12_2_ = uVar104;
  auVar176._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar60;
  auVar175._10_2_ = uVar104;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar104;
  auVar174._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar41._4_8_ = auVar174._8_8_;
  auVar41._2_2_ = uVar104;
  auVar41._0_2_ = uVar104;
  fVar245 = (float)((int)sVar75 >> 8);
  fVar258 = (float)(auVar41._0_4_ >> 0x18);
  fVar261 = (float)(auVar174._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 0x1a + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar60;
  auVar179._12_2_ = uVar104;
  auVar179._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar60;
  auVar178._10_2_ = uVar104;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar104;
  auVar177._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar42._4_8_ = auVar177._8_8_;
  auVar42._2_2_ = uVar104;
  auVar42._0_2_ = uVar104;
  fVar218 = (float)((int)sVar75 >> 8);
  fVar229 = (float)(auVar42._0_4_ >> 0x18);
  fVar234 = (float)(auVar177._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 0x1b + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar60;
  auVar182._12_2_ = uVar104;
  auVar182._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar60;
  auVar181._10_2_ = uVar104;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar104;
  auVar180._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar43._4_8_ = auVar180._8_8_;
  auVar43._2_2_ = uVar104;
  auVar43._0_2_ = uVar104;
  fVar266 = (float)((int)sVar75 >> 8);
  fVar277 = (float)(auVar43._0_4_ >> 0x18);
  fVar280 = (float)(auVar180._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar59 * 0x1c + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar33 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar103),uVar103);
  sVar75 = CONCAT11((char)uVar14,(char)uVar14);
  uVar60 = CONCAT62(uVar35,sVar75);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar60;
  auVar185._12_2_ = uVar104;
  auVar185._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar33 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar60;
  auVar184._10_2_ = uVar104;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar104;
  auVar183._0_8_ = uVar60;
  uVar104 = (undefined2)uVar35;
  auVar44._4_8_ = auVar183._8_8_;
  auVar44._2_2_ = uVar104;
  auVar44._0_2_ = uVar104;
  fVar107 = (float)((int)sVar75 >> 8);
  fVar126 = (float)(auVar44._0_4_ >> 0x18);
  fVar127 = (float)(auVar183._8_4_ >> 0x18);
  fVar305 = fVar128 * fVar321 + fVar145 * fVar165 + fVar146 * fVar195;
  fVar315 = fVar128 * fVar326 + fVar145 * fVar168 + fVar146 * fVar205;
  fVar317 = fVar128 * fVar327 + fVar145 * fVar169 + fVar146 * fVar206;
  fVar319 = fVar128 * (float)(auVar130._12_4_ >> 0x18) +
            fVar145 * (float)(auVar109._12_4_ >> 0x18) + fVar146 * (float)(auVar112._12_4_ >> 0x18);
  fVar285 = fVar128 * fVar76 + fVar145 * fVar207 + fVar146 * fVar245;
  fVar296 = fVar128 * fVar105 + fVar145 * fVar216 + fVar146 * fVar258;
  fVar299 = fVar128 * fVar106 + fVar145 * fVar217 + fVar146 * fVar261;
  fVar302 = fVar128 * (float)(auVar115._12_4_ >> 0x18) +
            fVar145 * (float)(auVar172._12_4_ >> 0x18) + fVar146 * (float)(auVar175._12_4_ >> 0x18);
  fVar170 = fVar128 * fVar218 + fVar145 * fVar266 + fVar146 * fVar107;
  fVar193 = fVar128 * fVar229 + fVar145 * fVar277 + fVar146 * fVar126;
  fVar194 = fVar128 * fVar234 + fVar145 * fVar280 + fVar146 * fVar127;
  fVar128 = fVar128 * (float)(auVar178._12_4_ >> 0x18) +
            fVar145 * (float)(auVar181._12_4_ >> 0x18) + fVar146 * (float)(auVar184._12_4_ >> 0x18);
  fVar322 = fVar321 * fVar147 + fVar165 * fVar163 + fVar195 * fVar164;
  fVar326 = fVar326 * fVar147 + fVar168 * fVar163 + fVar205 * fVar164;
  fVar327 = fVar327 * fVar147 + fVar169 * fVar163 + fVar206 * fVar164;
  fVar328 = (float)(auVar130._12_4_ >> 0x18) * fVar147 +
            (float)(auVar109._12_4_ >> 0x18) * fVar163 + (float)(auVar112._12_4_ >> 0x18) * fVar164;
  fVar245 = fVar76 * fVar147 + fVar207 * fVar163 + fVar245 * fVar164;
  fVar258 = fVar105 * fVar147 + fVar216 * fVar163 + fVar258 * fVar164;
  fVar261 = fVar106 * fVar147 + fVar217 * fVar163 + fVar261 * fVar164;
  fVar321 = (float)(auVar115._12_4_ >> 0x18) * fVar147 +
            (float)(auVar172._12_4_ >> 0x18) * fVar163 + (float)(auVar175._12_4_ >> 0x18) * fVar164;
  fVar218 = fVar147 * fVar218 + fVar163 * fVar266 + fVar164 * fVar107;
  fVar229 = fVar147 * fVar229 + fVar163 * fVar277 + fVar164 * fVar126;
  fVar234 = fVar147 * fVar234 + fVar163 * fVar280 + fVar164 * fVar127;
  fVar266 = fVar147 * (float)(auVar178._12_4_ >> 0x18) +
            fVar163 * (float)(auVar181._12_4_ >> 0x18) + fVar164 * (float)(auVar184._12_4_ >> 0x18);
  fVar146 = (float)DAT_01ff1d40;
  fVar76 = DAT_01ff1d40._4_4_;
  fVar105 = DAT_01ff1d40._8_4_;
  fVar106 = DAT_01ff1d40._12_4_;
  uVar70 = -(uint)(fVar146 <= ABS(fVar305));
  uVar71 = -(uint)(fVar76 <= ABS(fVar315));
  uVar73 = -(uint)(fVar105 <= ABS(fVar317));
  uVar74 = -(uint)(fVar106 <= ABS(fVar319));
  auVar307._0_4_ = (uint)fVar305 & uVar70;
  auVar307._4_4_ = (uint)fVar315 & uVar71;
  auVar307._8_4_ = (uint)fVar317 & uVar73;
  auVar307._12_4_ = (uint)fVar319 & uVar74;
  auVar148._0_4_ = ~uVar70 & (uint)fVar146;
  auVar148._4_4_ = ~uVar71 & (uint)fVar76;
  auVar148._8_4_ = ~uVar73 & (uint)fVar105;
  auVar148._12_4_ = ~uVar74 & (uint)fVar106;
  auVar148 = auVar148 | auVar307;
  uVar70 = -(uint)(fVar146 <= ABS(fVar285));
  uVar71 = -(uint)(fVar76 <= ABS(fVar296));
  uVar73 = -(uint)(fVar105 <= ABS(fVar299));
  uVar74 = -(uint)(fVar106 <= ABS(fVar302));
  auVar288._0_4_ = (uint)fVar285 & uVar70;
  auVar288._4_4_ = (uint)fVar296 & uVar71;
  auVar288._8_4_ = (uint)fVar299 & uVar73;
  auVar288._12_4_ = (uint)fVar302 & uVar74;
  auVar196._0_4_ = ~uVar70 & (uint)fVar146;
  auVar196._4_4_ = ~uVar71 & (uint)fVar76;
  auVar196._8_4_ = ~uVar73 & (uint)fVar105;
  auVar196._12_4_ = ~uVar74 & (uint)fVar106;
  auVar196 = auVar196 | auVar288;
  uVar70 = -(uint)(fVar146 <= ABS(fVar170));
  uVar71 = -(uint)(fVar76 <= ABS(fVar193));
  uVar73 = -(uint)(fVar105 <= ABS(fVar194));
  uVar74 = -(uint)(fVar106 <= ABS(fVar128));
  auVar186._0_4_ = (uint)fVar170 & uVar70;
  auVar186._4_4_ = (uint)fVar193 & uVar71;
  auVar186._8_4_ = (uint)fVar194 & uVar73;
  auVar186._12_4_ = (uint)fVar128 & uVar74;
  auVar208._0_4_ = ~uVar70 & (uint)fVar146;
  auVar208._4_4_ = ~uVar71 & (uint)fVar76;
  auVar208._8_4_ = ~uVar73 & (uint)fVar105;
  auVar208._12_4_ = ~uVar74 & (uint)fVar106;
  auVar208 = auVar208 | auVar186;
  auVar77 = rcpps(_DAT_01ff1d40,auVar148);
  fVar146 = auVar77._0_4_;
  fVar106 = auVar77._4_4_;
  fVar165 = auVar77._8_4_;
  fVar207 = auVar77._12_4_;
  fVar146 = (1.0 - auVar148._0_4_ * fVar146) * fVar146 + fVar146;
  fVar106 = (1.0 - auVar148._4_4_ * fVar106) * fVar106 + fVar106;
  fVar165 = (1.0 - auVar148._8_4_ * fVar165) * fVar165 + fVar165;
  fVar207 = (1.0 - auVar148._12_4_ * fVar207) * fVar207 + fVar207;
  auVar77 = rcpps(auVar77,auVar196);
  fVar76 = auVar77._0_4_;
  fVar107 = auVar77._4_4_;
  fVar168 = auVar77._8_4_;
  fVar216 = auVar77._12_4_;
  fVar76 = (1.0 - auVar196._0_4_ * fVar76) * fVar76 + fVar76;
  fVar107 = (1.0 - auVar196._4_4_ * fVar107) * fVar107 + fVar107;
  fVar168 = (1.0 - auVar196._8_4_ * fVar168) * fVar168 + fVar168;
  fVar216 = (1.0 - auVar196._12_4_ * fVar216) * fVar216 + fVar216;
  auVar77 = rcpps(auVar77,auVar208);
  fVar105 = auVar77._0_4_;
  fVar126 = auVar77._4_4_;
  fVar169 = auVar77._8_4_;
  fVar217 = auVar77._12_4_;
  fVar105 = (1.0 - auVar208._0_4_ * fVar105) * fVar105 + fVar105;
  fVar126 = (1.0 - auVar208._4_4_ * fVar126) * fVar126 + fVar126;
  fVar169 = (1.0 - auVar208._8_4_ * fVar169) * fVar169 + fVar169;
  fVar217 = (1.0 - auVar208._12_4_ * fVar217) * fVar217 + fVar217;
  fVar277 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar59 * 7 + 6);
  uVar104 = (undefined2)(uVar60 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar60;
  auVar78._12_2_ = uVar104;
  auVar78._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar60 >> 0x20);
  auVar330._12_4_ = auVar78._12_4_;
  auVar330._8_2_ = 0;
  auVar330._0_8_ = uVar60;
  auVar330._10_2_ = uVar104;
  auVar132._10_6_ = auVar330._10_6_;
  auVar132._8_2_ = uVar104;
  auVar132._0_8_ = uVar60;
  uVar104 = (undefined2)(uVar60 >> 0x10);
  auVar45._4_8_ = auVar132._8_8_;
  auVar45._2_2_ = uVar104;
  auVar45._0_2_ = uVar104;
  fVar127 = (float)(auVar45._0_4_ >> 0x10);
  fVar170 = (float)(auVar132._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar59 * 0xb + 6);
  uVar104 = (undefined2)(uVar5 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar5;
  auVar151._12_2_ = uVar104;
  auVar151._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar5 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar5;
  auVar150._10_2_ = uVar104;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar104;
  auVar149._0_8_ = uVar5;
  uVar104 = (undefined2)(uVar5 >> 0x10);
  auVar46._4_8_ = auVar149._8_8_;
  auVar46._2_2_ = uVar104;
  auVar46._0_2_ = uVar104;
  uVar62 = *(ulong *)(prim + uVar59 * 9 + 6);
  uVar104 = (undefined2)(uVar62 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar62;
  auVar81._12_2_ = uVar104;
  auVar81._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar62 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar62;
  auVar80._10_2_ = uVar104;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar104;
  auVar79._0_8_ = uVar62;
  uVar104 = (undefined2)(uVar62 >> 0x10);
  auVar47._4_8_ = auVar79._8_8_;
  auVar47._2_2_ = uVar104;
  auVar47._0_2_ = uVar104;
  fVar128 = (float)(auVar47._0_4_ >> 0x10);
  fVar193 = (float)(auVar79._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar59 * 0xd + 6);
  uVar104 = (undefined2)(uVar6 >> 0x30);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar6;
  auVar211._12_2_ = uVar104;
  auVar211._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar6 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar6;
  auVar210._10_2_ = uVar104;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar104;
  auVar209._0_8_ = uVar6;
  uVar104 = (undefined2)(uVar6 >> 0x10);
  auVar48._4_8_ = auVar209._8_8_;
  auVar48._2_2_ = uVar104;
  auVar48._0_2_ = uVar104;
  uVar7 = *(ulong *)(prim + uVar59 * 0x12 + 6);
  uVar104 = (undefined2)(uVar7 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar7;
  auVar84._12_2_ = uVar104;
  auVar84._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar7 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar7;
  auVar83._10_2_ = uVar104;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar104;
  auVar82._0_8_ = uVar7;
  uVar104 = (undefined2)(uVar7 >> 0x10);
  auVar49._4_8_ = auVar82._8_8_;
  auVar49._2_2_ = uVar104;
  auVar49._0_2_ = uVar104;
  fVar145 = (float)(auVar49._0_4_ >> 0x10);
  fVar194 = (float)(auVar82._8_4_ >> 0x10);
  uVar67 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar59 * 2 + uVar67 + 6);
  uVar104 = (undefined2)(uVar8 >> 0x30);
  auVar250._8_4_ = 0;
  auVar250._0_8_ = uVar8;
  auVar250._12_2_ = uVar104;
  auVar250._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar8 >> 0x20);
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar8;
  auVar249._10_2_ = uVar104;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._8_2_ = uVar104;
  auVar248._0_8_ = uVar8;
  uVar104 = (undefined2)(uVar8 >> 0x10);
  auVar50._4_8_ = auVar248._8_8_;
  auVar50._2_2_ = uVar104;
  auVar50._0_2_ = uVar104;
  uVar67 = *(ulong *)(prim + uVar67 + 6);
  uVar104 = (undefined2)(uVar67 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar67;
  auVar87._12_2_ = uVar104;
  auVar87._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar67 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar67;
  auVar86._10_2_ = uVar104;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar104;
  auVar85._0_8_ = uVar67;
  uVar104 = (undefined2)(uVar67 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar104;
  auVar51._0_2_ = uVar104;
  fVar147 = (float)(auVar51._0_4_ >> 0x10);
  fVar195 = (float)(auVar85._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar59 * 0x18 + 6);
  uVar104 = (undefined2)(uVar9 >> 0x30);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar9;
  auVar271._12_2_ = uVar104;
  auVar271._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar9 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar9;
  auVar270._10_2_ = uVar104;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar104;
  auVar269._0_8_ = uVar9;
  uVar104 = (undefined2)(uVar9 >> 0x10);
  auVar52._4_8_ = auVar269._8_8_;
  auVar52._2_2_ = uVar104;
  auVar52._0_2_ = uVar104;
  uVar10 = *(ulong *)(prim + uVar59 * 0x1d + 6);
  uVar104 = (undefined2)(uVar10 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar10;
  auVar90._12_2_ = uVar104;
  auVar90._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar10 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar10;
  auVar89._10_2_ = uVar104;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar104;
  auVar88._0_8_ = uVar10;
  uVar104 = (undefined2)(uVar10 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar104;
  auVar53._0_2_ = uVar104;
  fVar163 = (float)(auVar53._0_4_ >> 0x10);
  fVar205 = (float)(auVar88._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar59 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar104 = (undefined2)(uVar11 >> 0x30);
  auVar291._8_4_ = 0;
  auVar291._0_8_ = uVar11;
  auVar291._12_2_ = uVar104;
  auVar291._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar11 >> 0x20);
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._8_2_ = 0;
  auVar290._0_8_ = uVar11;
  auVar290._10_2_ = uVar104;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = uVar104;
  auVar289._0_8_ = uVar11;
  uVar104 = (undefined2)(uVar11 >> 0x10);
  auVar54._4_8_ = auVar289._8_8_;
  auVar54._2_2_ = uVar104;
  auVar54._0_2_ = uVar104;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar59) + 6);
  uVar104 = (undefined2)(uVar12 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar12;
  auVar93._12_2_ = uVar104;
  auVar93._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar12 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar12;
  auVar92._10_2_ = uVar104;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar104;
  auVar91._0_8_ = uVar12;
  uVar104 = (undefined2)(uVar12 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar104;
  auVar55._0_2_ = uVar104;
  fVar164 = (float)(auVar55._0_4_ >> 0x10);
  fVar206 = (float)(auVar91._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar59 * 0x23 + 6);
  uVar104 = (undefined2)(uVar59 >> 0x30);
  auVar310._8_4_ = 0;
  auVar310._0_8_ = uVar59;
  auVar310._12_2_ = uVar104;
  auVar310._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar59 >> 0x20);
  auVar309._12_4_ = auVar310._12_4_;
  auVar309._8_2_ = 0;
  auVar309._0_8_ = uVar59;
  auVar309._10_2_ = uVar104;
  auVar308._10_6_ = auVar309._10_6_;
  auVar308._8_2_ = uVar104;
  auVar308._0_8_ = uVar59;
  uVar104 = (undefined2)(uVar59 >> 0x10);
  auVar56._4_8_ = auVar308._8_8_;
  auVar56._2_2_ = uVar104;
  auVar56._0_2_ = uVar104;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar127) * fVar277 + fVar127) - fVar326) *
                fVar106,((((float)(int)(short)uVar5 - (float)(int)(short)uVar60) * fVar277 +
                         (float)(int)(short)uVar60) - fVar322) * fVar146);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar170) * fVar277 + fVar170) - fVar327) * fVar165;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar330._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar330._12_4_ >> 0x10)) - fVar328) * fVar207;
  auVar212._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar62) * fVar277 +
        (float)(int)(short)uVar62) - fVar322) * fVar146;
  auVar212._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar128) * fVar277 + fVar128) - fVar326) * fVar106;
  auVar212._8_4_ =
       ((((float)(auVar209._8_4_ >> 0x10) - fVar193) * fVar277 + fVar193) - fVar327) * fVar165;
  auVar212._12_4_ =
       ((((float)(auVar210._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar328) * fVar207;
  auVar251._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar145) * fVar277 + fVar145) - fVar258) *
                fVar107,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar277 +
                         (float)(int)(short)uVar7) - fVar245) * fVar76);
  auVar251._8_4_ =
       ((((float)(auVar248._8_4_ >> 0x10) - fVar194) * fVar277 + fVar194) - fVar261) * fVar168;
  auVar251._12_4_ =
       ((((float)(auVar249._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar321) * fVar216;
  auVar272._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar67) * fVar277 +
        (float)(int)(short)uVar67) - fVar245) * fVar76;
  auVar272._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar147) * fVar277 + fVar147) - fVar258) * fVar107;
  auVar272._8_4_ =
       ((((float)(auVar269._8_4_ >> 0x10) - fVar195) * fVar277 + fVar195) - fVar261) * fVar168;
  auVar272._12_4_ =
       ((((float)(auVar270._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar321) * fVar216;
  auVar292._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar163) * fVar277 + fVar163) - fVar229) *
                fVar126,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar277 +
                         (float)(int)(short)uVar10) - fVar218) * fVar105);
  auVar292._8_4_ =
       ((((float)(auVar289._8_4_ >> 0x10) - fVar205) * fVar277 + fVar205) - fVar234) * fVar169;
  auVar292._12_4_ =
       ((((float)(auVar290._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar266) * fVar217;
  auVar311._0_4_ =
       ((((float)(int)(short)uVar59 - (float)(int)(short)uVar12) * fVar277 +
        (float)(int)(short)uVar12) - fVar218) * fVar105;
  auVar311._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar164) * fVar277 + fVar164) - fVar229) * fVar126;
  auVar311._8_4_ =
       ((((float)(auVar308._8_4_ >> 0x10) - fVar206) * fVar277 + fVar206) - fVar234) * fVar169;
  auVar311._12_4_ =
       ((((float)(auVar309._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar266) * fVar217;
  auVar129._8_4_ = auVar152._8_4_;
  auVar129._0_8_ = auVar152._0_8_;
  auVar129._12_4_ = auVar152._12_4_;
  auVar130 = minps(auVar129,auVar212);
  auVar94._8_4_ = auVar251._8_4_;
  auVar94._0_8_ = auVar251._0_8_;
  auVar94._12_4_ = auVar251._12_4_;
  auVar77 = minps(auVar94,auVar272);
  auVar130 = maxps(auVar130,auVar77);
  auVar95._8_4_ = auVar292._8_4_;
  auVar95._0_8_ = auVar292._0_8_;
  auVar95._12_4_ = auVar292._12_4_;
  auVar77 = minps(auVar95,auVar311);
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar117._4_4_ = uVar14;
  auVar117._0_4_ = uVar14;
  auVar117._8_4_ = uVar14;
  auVar117._12_4_ = uVar14;
  auVar77 = maxps(auVar77,auVar117);
  auVar77 = maxps(auVar130,auVar77);
  local_1b8 = auVar77._0_4_ * 0.99999964;
  fStack_1b4 = auVar77._4_4_ * 0.99999964;
  fStack_1b0 = auVar77._8_4_ * 0.99999964;
  fStack_1ac = auVar77._12_4_ * 0.99999964;
  auVar77 = maxps(auVar152,auVar212);
  auVar130 = maxps(auVar251,auVar272);
  auVar77 = minps(auVar77,auVar130);
  auVar130 = maxps(auVar292,auVar311);
  fVar146 = (ray->super_RayK<1>).tfar;
  auVar96._4_4_ = fVar146;
  auVar96._0_4_ = fVar146;
  auVar96._8_4_ = fVar146;
  auVar96._12_4_ = fVar146;
  auVar130 = minps(auVar130,auVar96);
  auVar77 = minps(auVar77,auVar130);
  uVar70 = (uint)(byte)PVar13;
  auVar118._0_4_ = -(uint)(uVar70 != 0 && local_1b8 <= auVar77._0_4_ * 1.0000004);
  auVar118._4_4_ = -(uint)(1 < uVar70 && fStack_1b4 <= auVar77._4_4_ * 1.0000004);
  auVar118._8_4_ = -(uint)(2 < uVar70 && fStack_1b0 <= auVar77._8_4_ * 1.0000004);
  auVar118._12_4_ = -(uint)(3 < uVar70 && fStack_1ac <= auVar77._12_4_ * 1.0000004);
  uVar70 = movmskps(uVar70,auVar118);
  if (uVar70 == 0) {
    return;
  }
  uVar70 = uVar70 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f0 = prim;
LAB_00c0ff37:
  lVar22 = 0;
  if ((ulong)uVar70 != 0) {
    for (; (uVar70 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
    }
  }
  uVar71 = *(uint *)(local_2f0 + 2);
  uVar73 = *(uint *)(local_2f0 + lVar22 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar71].ptr;
  fVar146 = pGVar15->fnumTimeSegments;
  fVar76 = (pGVar15->time_range).lower;
  fVar105 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar76) /
            ((pGVar15->time_range).upper - fVar76)) * fVar146;
  fVar76 = floorf(fVar105);
  fVar146 = fVar146 + -1.0;
  if (fVar146 <= fVar76) {
    fVar76 = fVar146;
  }
  fVar146 = 0.0;
  if (0.0 <= fVar76) {
    fVar146 = fVar76;
  }
  local_350 = (ulong)uVar73;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar73 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)fVar146 * 0x38;
  lVar22 = *(long *)(_Var16 + 0x10 + lVar66);
  pfVar1 = (float *)(*(long *)(_Var16 + lVar66) + lVar22 * uVar60);
  fVar76 = *pfVar1;
  fVar106 = pfVar1[1];
  fVar107 = pfVar1[2];
  fVar126 = pfVar1[3];
  pRVar65 = (RTCIntersectArguments *)(uVar60 + 1);
  pfVar1 = (float *)(*(long *)(_Var16 + lVar66) + lVar22 * (long)pRVar65);
  fVar127 = *pfVar1;
  fVar128 = pfVar1[1];
  fVar145 = pfVar1[2];
  fVar147 = pfVar1[3];
  p_Var17 = pGVar15[4].occlusionFilterN;
  lVar22 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar22 + 0x10 + lVar66);
  pfVar1 = (float *)(*(long *)(lVar22 + lVar66) + lVar18 * uVar60);
  fVar163 = *pfVar1;
  fVar164 = pfVar1[1];
  fVar165 = pfVar1[2];
  fVar168 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar22 + lVar66) + lVar18 * (long)pRVar65);
  fVar169 = *pfVar1;
  fVar170 = pfVar1[1];
  fVar193 = pfVar1[2];
  fVar194 = pfVar1[3];
  _Var19 = pGVar15[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar18 = *(long *)(_Var19 + 0x10 + lVar66);
  pfVar1 = (float *)(*(long *)(_Var19 + lVar66) + lVar18 * uVar60);
  pfVar2 = (float *)(*(long *)(_Var19 + lVar66) + lVar18 * (long)pRVar65);
  pfVar3 = (float *)(*(long *)(p_Var17 + lVar66) + *(long *)(p_Var17 + lVar66 + 0x10) * uVar60);
  fVar105 = fVar105 - fVar146;
  fVar146 = *pfVar3 * 0.33333334 + fVar76;
  fVar195 = pfVar3[1] * 0.33333334 + fVar106;
  fVar205 = pfVar3[2] * 0.33333334 + fVar107;
  fVar206 = pfVar3[3] * 0.33333334 + fVar126;
  pfVar3 = (float *)(*(long *)(p_Var17 + lVar66) +
                    *(long *)(p_Var17 + lVar66 + 0x10) * (long)pRVar65);
  fVar218 = fVar127 - *pfVar3 * 0.33333334;
  fVar277 = fVar128 - pfVar3[1] * 0.33333334;
  fVar296 = fVar145 - pfVar3[2] * 0.33333334;
  fVar302 = fVar147 - pfVar3[3] * 0.33333334;
  fVar245 = *pfVar1 * 0.33333334 + fVar163;
  fVar280 = pfVar1[1] * 0.33333334 + fVar164;
  fVar319 = pfVar1[2] * 0.33333334 + fVar165;
  fVar322 = pfVar1[3] * 0.33333334 + fVar168;
  fVar326 = fVar169 - *pfVar2 * 0.33333334;
  fVar328 = fVar170 - pfVar2[1] * 0.33333334;
  fVar235 = fVar193 - pfVar2[2] * 0.33333334;
  fVar240 = fVar194 - pfVar2[3] * 0.33333334;
  fVar207 = fVar218 * 0.0;
  fVar216 = fVar277 * 0.0;
  fVar217 = fVar296 * 0.0;
  fVar261 = fVar302 * 0.0;
  fVar258 = fVar127 * 0.0 + fVar207;
  fVar321 = fVar128 * 0.0 + fVar216;
  fVar229 = fVar145 * 0.0 + fVar217;
  fVar266 = fVar147 * 0.0 + fVar261;
  fVar267 = fVar146 * 0.0;
  fVar278 = fVar195 * 0.0;
  fVar281 = fVar205 * 0.0;
  fVar283 = fVar206 * 0.0;
  fVar234 = fVar267 + fVar258 + fVar76;
  fVar285 = fVar278 + fVar321 + fVar106;
  fVar299 = fVar281 + fVar229 + fVar107;
  fVar305 = fVar283 + fVar266 + fVar126;
  fVar258 = (fVar146 * 3.0 + fVar258) - fVar76 * 3.0;
  fVar321 = (fVar195 * 3.0 + fVar321) - fVar106 * 3.0;
  fVar229 = (fVar205 * 3.0 + fVar229) - fVar107 * 3.0;
  fVar266 = (fVar206 * 3.0 + fVar266) - fVar126 * 3.0;
  fVar268 = fVar326 * 0.0;
  fVar279 = fVar328 * 0.0;
  fVar282 = fVar235 * 0.0;
  fVar284 = fVar240 * 0.0;
  fVar146 = fVar169 * 0.0 + fVar268;
  fVar195 = fVar170 * 0.0 + fVar279;
  fVar205 = fVar193 * 0.0 + fVar282;
  fVar206 = fVar194 * 0.0 + fVar284;
  fVar286 = fVar245 * 0.0;
  fVar297 = fVar280 * 0.0;
  fVar300 = fVar319 * 0.0;
  fVar303 = fVar322 * 0.0;
  fVar327 = fVar286 + fVar146 + fVar163;
  fVar230 = fVar297 + fVar195 + fVar164;
  fVar236 = fVar300 + fVar205 + fVar165;
  fVar241 = fVar303 + fVar206 + fVar168;
  fVar315 = (fVar245 * 3.0 + fVar146) - fVar163 * 3.0;
  fVar317 = (fVar280 * 3.0 + fVar195) - fVar164 * 3.0;
  fVar319 = (fVar319 * 3.0 + fVar205) - fVar165 * 3.0;
  fVar322 = (fVar322 * 3.0 + fVar206) - fVar168 * 3.0;
  fVar206 = fVar207 + fVar127 + fVar267 + fVar76 * 0.0;
  fVar216 = fVar216 + fVar128 + fVar278 + fVar106 * 0.0;
  fVar245 = fVar217 + fVar145 + fVar281 + fVar107 * 0.0;
  fVar280 = fVar261 + fVar147 + fVar283 + fVar126 * 0.0;
  fVar195 = ((fVar127 * 3.0 - fVar218 * 3.0) + fVar267) - fVar76 * 0.0;
  fVar205 = ((fVar128 * 3.0 - fVar277 * 3.0) + fVar278) - fVar106 * 0.0;
  fVar207 = ((fVar145 * 3.0 - fVar296 * 3.0) + fVar281) - fVar107 * 0.0;
  fVar217 = ((fVar147 * 3.0 - fVar302 * 3.0) + fVar283) - fVar126 * 0.0;
  fVar107 = fVar268 + fVar169 + fVar286 + fVar163 * 0.0;
  fVar126 = fVar279 + fVar170 + fVar297 + fVar164 * 0.0;
  fVar127 = fVar282 + fVar193 + fVar300 + fVar165 * 0.0;
  fVar128 = fVar284 + fVar194 + fVar303 + fVar168 * 0.0;
  fVar146 = ((fVar169 * 3.0 - fVar326 * 3.0) + fVar286) - fVar163 * 0.0;
  fVar76 = ((fVar170 * 3.0 - fVar328 * 3.0) + fVar297) - fVar164 * 0.0;
  fVar106 = ((fVar193 * 3.0 - fVar235 * 3.0) + fVar300) - fVar165 * 0.0;
  fVar169 = ((fVar194 * 3.0 - fVar240 * 3.0) + fVar303) - fVar168 * 0.0;
  fVar235 = fVar321 * fVar327 - fVar230 * fVar258;
  fVar240 = fVar229 * fVar230 - fVar236 * fVar321;
  fVar236 = fVar258 * fVar236 - fVar327 * fVar229;
  fVar241 = fVar266 * fVar241 - fVar241 * fVar266;
  fVar218 = fVar321 * fVar315 - fVar317 * fVar258;
  fVar327 = fVar229 * fVar317 - fVar319 * fVar321;
  fVar319 = fVar258 * fVar319 - fVar315 * fVar229;
  fVar302 = fVar205 * fVar107 - fVar126 * fVar195;
  fVar315 = fVar207 * fVar126 - fVar127 * fVar205;
  fVar317 = fVar195 * fVar127 - fVar107 * fVar207;
  fVar326 = fVar217 * fVar128 - fVar128 * fVar217;
  fVar193 = fVar205 * fVar146 - fVar76 * fVar195;
  fVar194 = fVar207 * fVar76 - fVar106 * fVar205;
  fVar296 = fVar195 * fVar106 - fVar146 * fVar207;
  fVar168 = fVar236 * fVar236 + fVar240 * fVar240 + fVar235 * fVar235;
  auVar77 = ZEXT416((uint)fVar168);
  auVar130 = rsqrtss(ZEXT416((uint)fVar168),auVar77);
  fVar146 = auVar130._0_4_;
  fVar328 = fVar146 * 1.5 - fVar146 * fVar146 * fVar168 * 0.5 * fVar146;
  fVar267 = fVar235 * fVar218 + fVar236 * fVar319 + fVar240 * fVar327;
  fVar261 = fVar241 * fVar328;
  auVar77 = rcpss(auVar77,auVar77);
  fVar277 = (2.0 - fVar168 * auVar77._0_4_) * auVar77._0_4_;
  fVar230 = fVar317 * fVar317 + fVar315 * fVar315 + fVar302 * fVar302;
  auVar130 = ZEXT416((uint)fVar230);
  auVar77 = rsqrtss(ZEXT416((uint)fVar230),auVar130);
  fVar146 = auVar77._0_4_;
  fVar268 = fVar146 * 1.5 - fVar146 * fVar146 * fVar230 * 0.5 * fVar146;
  fVar278 = fVar302 * fVar193 + fVar317 * fVar296 + fVar315 * fVar194;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar66);
  lVar20 = *(long *)(_Var16 + 0x48 + lVar66);
  pfVar1 = (float *)(lVar18 + lVar20 * uVar60);
  fVar146 = *pfVar1;
  fVar76 = pfVar1[1];
  fVar106 = pfVar1[2];
  fVar107 = pfVar1[3];
  pfVar1 = (float *)(lVar18 + lVar20 * (long)pRVar65);
  fVar126 = *pfVar1;
  fVar127 = pfVar1[1];
  fVar128 = pfVar1[2];
  fVar145 = pfVar1[3];
  lVar18 = *(long *)(lVar22 + 0x38 + lVar66);
  lVar22 = *(long *)(lVar22 + 0x48 + lVar66);
  pfVar1 = (float *)(lVar18 + lVar22 * (long)pRVar65);
  fVar147 = *pfVar1;
  fVar163 = pfVar1[1];
  fVar164 = pfVar1[2];
  fVar165 = pfVar1[3];
  lVar20 = *(long *)(_Var19 + 0x38 + lVar66);
  lVar21 = *(long *)(_Var19 + 0x48 + lVar66);
  auVar77 = rcpss(auVar130,auVar130);
  pfVar1 = (float *)(lVar20 + lVar21 * (long)pRVar65);
  fVar170 = fVar326 * fVar268;
  fVar279 = (2.0 - fVar230 * auVar77._0_4_) * auVar77._0_4_;
  fVar336 = fVar305 * fVar240 * fVar328;
  fVar343 = fVar305 * fVar236 * fVar328;
  fVar344 = fVar305 * fVar235 * fVar328;
  fVar345 = fVar305 * fVar261;
  fVar300 = fVar234 - fVar336;
  fVar231 = fVar285 - fVar343;
  fVar237 = fVar299 - fVar344;
  fVar242 = fVar305 - fVar345;
  fVar306 = fVar305 * fVar277 * (fVar168 * fVar327 - fVar267 * fVar240) * fVar328 +
            fVar266 * fVar240 * fVar328;
  fVar316 = fVar305 * fVar277 * (fVar168 * fVar319 - fVar267 * fVar236) * fVar328 +
            fVar266 * fVar236 * fVar328;
  fVar318 = fVar305 * fVar277 * (fVar168 * fVar218 - fVar267 * fVar235) * fVar328 +
            fVar266 * fVar235 * fVar328;
  fVar320 = fVar305 * fVar277 * (fVar168 * (fVar266 * fVar322 - fVar322 * fVar266) -
                                fVar267 * fVar241) * fVar328 + fVar266 * fVar261;
  fVar336 = fVar336 + fVar234;
  fVar343 = fVar343 + fVar285;
  fVar344 = fVar344 + fVar299;
  fVar345 = fVar345 + fVar305;
  fVar261 = fVar280 * fVar315 * fVar268;
  fVar218 = fVar280 * fVar317 * fVar268;
  fVar234 = fVar280 * fVar302 * fVar268;
  fVar277 = fVar280 * fVar170;
  pfVar2 = (float *)(*(long *)(p_Var17 + lVar66 + 0x38) +
                    *(long *)(p_Var17 + lVar66 + 0x48) * (long)pRVar65);
  fVar246 = fVar206 - fVar261;
  fVar259 = fVar216 - fVar218;
  fVar262 = fVar245 - fVar234;
  fVar264 = fVar280 - fVar277;
  fVar319 = fVar280 * fVar279 * (fVar230 * fVar194 - fVar278 * fVar315) * fVar268 +
            fVar217 * fVar315 * fVar268;
  fVar327 = fVar280 * fVar279 * (fVar230 * fVar296 - fVar278 * fVar317) * fVar268 +
            fVar217 * fVar317 * fVar268;
  fVar235 = fVar280 * fVar279 * (fVar230 * fVar193 - fVar278 * fVar302) * fVar268 +
            fVar217 * fVar302 * fVar268;
  fVar241 = fVar280 * fVar279 * (fVar230 * (fVar217 * fVar169 - fVar169 * fVar217) -
                                fVar278 * fVar326) * fVar268 + fVar217 * fVar170;
  fVar261 = fVar261 + fVar206;
  fVar218 = fVar218 + fVar216;
  fVar234 = fVar234 + fVar245;
  fVar277 = fVar277 + fVar280;
  fVar280 = fVar126 - *pfVar2 * 0.33333334;
  fVar296 = fVar127 - pfVar2[1] * 0.33333334;
  fVar302 = fVar128 - pfVar2[2] * 0.33333334;
  fVar315 = fVar145 - pfVar2[3] * 0.33333334;
  fVar278 = fVar147 - *pfVar1 * 0.33333334;
  fVar281 = fVar163 - pfVar1[1] * 0.33333334;
  fVar283 = fVar164 - pfVar1[2] * 0.33333334;
  fVar286 = fVar165 - pfVar1[3] * 0.33333334;
  fVar194 = fVar280 * 0.0;
  fVar206 = fVar296 * 0.0;
  fVar216 = fVar302 * 0.0;
  fVar245 = fVar315 * 0.0;
  fVar303 = fVar126 * 0.0 + fVar194;
  fVar232 = fVar127 * 0.0 + fVar206;
  fVar238 = fVar128 * 0.0 + fVar216;
  fVar243 = fVar145 * 0.0 + fVar245;
  pfVar1 = (float *)(*(long *)(p_Var17 + lVar66 + 0x38) +
                    *(long *)(p_Var17 + lVar66 + 0x48) * uVar60);
  fVar168 = *pfVar1 * 0.33333334 + fVar146;
  fVar169 = pfVar1[1] * 0.33333334 + fVar76;
  fVar170 = pfVar1[2] * 0.33333334 + fVar106;
  fVar193 = pfVar1[3] * 0.33333334 + fVar107;
  fVar322 = fVar168 * 0.0;
  fVar328 = fVar169 * 0.0;
  fVar236 = fVar170 * 0.0;
  fVar267 = fVar193 * 0.0;
  fVar285 = (fVar168 * 3.0 + fVar303) - fVar146 * 3.0;
  fVar299 = (fVar169 * 3.0 + fVar232) - fVar76 * 3.0;
  fVar305 = (fVar170 * 3.0 + fVar238) - fVar106 * 3.0;
  fVar317 = (fVar193 * 3.0 + fVar243) - fVar107 * 3.0;
  fVar247 = fVar278 * 0.0;
  fVar260 = fVar281 * 0.0;
  fVar263 = fVar283 * 0.0;
  fVar265 = fVar286 * 0.0;
  fVar219 = fVar147 * 0.0 + fVar247;
  fVar233 = fVar163 * 0.0 + fVar260;
  fVar239 = fVar164 * 0.0 + fVar263;
  fVar244 = fVar165 * 0.0 + fVar265;
  pfVar1 = (float *)(lVar20 + uVar60 * lVar21);
  pfVar2 = (float *)(lVar18 + lVar22 * uVar60);
  fVar168 = *pfVar2;
  fVar169 = pfVar2[1];
  fVar170 = pfVar2[2];
  fVar193 = pfVar2[3];
  fVar326 = *pfVar1 * 0.33333334 + fVar168;
  fVar230 = pfVar1[1] * 0.33333334 + fVar169;
  fVar240 = pfVar1[2] * 0.33333334 + fVar170;
  fVar268 = pfVar1[3] * 0.33333334 + fVar193;
  fVar287 = fVar326 * 0.0;
  fVar298 = fVar230 * 0.0;
  fVar301 = fVar240 * 0.0;
  fVar304 = fVar268 * 0.0;
  fVar279 = (fVar326 * 3.0 + fVar219) - fVar168 * 3.0;
  fVar282 = (fVar230 * 3.0 + fVar233) - fVar169 * 3.0;
  fVar284 = (fVar240 * 3.0 + fVar239) - fVar170 * 3.0;
  fVar297 = (fVar268 * 3.0 + fVar244) - fVar193 * 3.0;
  fVar326 = fVar322 + fVar303 + fVar146;
  fVar230 = fVar328 + fVar232 + fVar76;
  fVar240 = fVar236 + fVar238 + fVar106;
  fVar268 = fVar267 + fVar243 + fVar107;
  fVar194 = fVar194 + fVar126 + fVar322 + fVar146 * 0.0;
  fVar206 = fVar206 + fVar127 + fVar328 + fVar76 * 0.0;
  fVar216 = fVar216 + fVar128 + fVar236 + fVar106 * 0.0;
  fVar245 = fVar245 + fVar145 + fVar267 + fVar107 * 0.0;
  fVar146 = ((fVar126 * 3.0 - fVar280 * 3.0) + fVar322) - fVar146 * 0.0;
  fVar76 = ((fVar127 * 3.0 - fVar296 * 3.0) + fVar328) - fVar76 * 0.0;
  fVar106 = ((fVar128 * 3.0 - fVar302 * 3.0) + fVar236) - fVar106 * 0.0;
  fVar107 = ((fVar145 * 3.0 - fVar315 * 3.0) + fVar267) - fVar107 * 0.0;
  fVar145 = fVar287 + fVar219 + fVar168;
  fVar322 = fVar298 + fVar233 + fVar169;
  fVar236 = fVar301 + fVar239 + fVar170;
  fVar303 = fVar304 + fVar244 + fVar193;
  fVar280 = fVar247 + fVar147 + fVar287 + fVar168 * 0.0;
  fVar296 = fVar260 + fVar163 + fVar298 + fVar169 * 0.0;
  fVar315 = fVar263 + fVar164 + fVar301 + fVar170 * 0.0;
  fVar328 = fVar265 + fVar165 + fVar304 + fVar193 * 0.0;
  fVar126 = ((fVar147 * 3.0 - fVar278 * 3.0) + fVar287) - fVar168 * 0.0;
  fVar127 = ((fVar163 * 3.0 - fVar281 * 3.0) + fVar298) - fVar169 * 0.0;
  fVar128 = ((fVar164 * 3.0 - fVar283 * 3.0) + fVar301) - fVar170 * 0.0;
  fVar302 = ((fVar165 * 3.0 - fVar286 * 3.0) + fVar304) - fVar193 * 0.0;
  fVar169 = fVar299 * fVar145 - fVar322 * fVar285;
  fVar170 = fVar305 * fVar322 - fVar236 * fVar299;
  fVar267 = fVar285 * fVar236 - fVar145 * fVar305;
  fVar286 = fVar317 * fVar303 - fVar303 * fVar317;
  fVar145 = fVar299 * fVar279 - fVar282 * fVar285;
  fVar163 = fVar305 * fVar282 - fVar284 * fVar299;
  fVar165 = fVar285 * fVar284 - fVar279 * fVar305;
  fVar322 = fVar76 * fVar280 - fVar296 * fVar146;
  fVar236 = fVar106 * fVar296 - fVar315 * fVar76;
  fVar278 = fVar146 * fVar315 - fVar280 * fVar106;
  fVar281 = fVar107 * fVar328 - fVar328 * fVar107;
  fVar147 = fVar76 * fVar126 - fVar127 * fVar146;
  fVar164 = fVar106 * fVar127 - fVar128 * fVar76;
  fVar168 = fVar146 * fVar128 - fVar126 * fVar106;
  fVar126 = fVar267 * fVar267 + fVar170 * fVar170 + fVar169 * fVar169;
  auVar77 = ZEXT416((uint)fVar126);
  auVar130 = rsqrtss(ZEXT416((uint)fVar126),auVar77);
  fVar127 = auVar130._0_4_;
  fVar328 = fVar127 * 1.5 - fVar127 * fVar127 * fVar126 * 0.5 * fVar127;
  fVar279 = fVar169 * fVar145 + fVar267 * fVar165 + fVar170 * fVar163;
  auVar77 = rcpss(auVar77,auVar77);
  fVar127 = (2.0 - fVar126 * auVar77._0_4_) * auVar77._0_4_;
  fVar128 = fVar286 * fVar328;
  fVar283 = fVar278 * fVar278 + fVar236 * fVar236 + fVar322 * fVar322;
  auVar77 = ZEXT416((uint)fVar283);
  auVar130 = rsqrtss(ZEXT416((uint)fVar283),auVar77);
  fVar193 = auVar130._0_4_;
  fVar303 = fVar193 * 1.5 - fVar193 * fVar193 * fVar283 * 0.5 * fVar193;
  fVar219 = fVar322 * fVar147 + fVar278 * fVar168 + fVar236 * fVar164;
  auVar77 = rcpss(auVar77,auVar77);
  fVar232 = (2.0 - fVar283 * auVar77._0_4_) * auVar77._0_4_;
  fVar284 = fVar281 * fVar303;
  fVar193 = fVar268 * fVar170 * fVar328;
  fVar280 = fVar268 * fVar267 * fVar328;
  fVar296 = fVar268 * fVar169 * fVar328;
  fVar315 = fVar268 * fVar128;
  fVar163 = fVar268 * fVar127 * (fVar126 * fVar163 - fVar279 * fVar170) * fVar328 +
            fVar317 * fVar170 * fVar328;
  fVar165 = fVar268 * fVar127 * (fVar126 * fVar165 - fVar279 * fVar267) * fVar328 +
            fVar317 * fVar267 * fVar328;
  fVar169 = fVar268 * fVar127 * (fVar126 * fVar145 - fVar279 * fVar169) * fVar328 +
            fVar317 * fVar169 * fVar328;
  fVar170 = fVar268 * fVar127 * (fVar126 * (fVar317 * fVar297 - fVar297 * fVar317) -
                                fVar279 * fVar286) * fVar328 + fVar317 * fVar128;
  fVar328 = fVar326 - fVar193;
  fVar267 = fVar230 - fVar280;
  fVar279 = fVar240 - fVar296;
  fVar282 = fVar268 - fVar315;
  fVar193 = fVar193 + fVar326;
  fVar280 = fVar280 + fVar230;
  fVar296 = fVar296 + fVar240;
  fVar315 = fVar315 + fVar268;
  fVar126 = fVar245 * fVar236 * fVar303;
  fVar127 = fVar245 * fVar278 * fVar303;
  fVar128 = fVar245 * fVar322 * fVar303;
  fVar145 = fVar245 * fVar284;
  fVar326 = fVar245 * fVar232 * (fVar283 * fVar164 - fVar219 * fVar236) * fVar303 +
            fVar107 * fVar236 * fVar303;
  fVar230 = fVar245 * fVar232 * (fVar283 * fVar168 - fVar219 * fVar278) * fVar303 +
            fVar107 * fVar278 * fVar303;
  fVar322 = fVar245 * fVar232 * (fVar283 * fVar147 - fVar219 * fVar322) * fVar303 +
            fVar107 * fVar322 * fVar303;
  fVar236 = fVar245 * fVar232 * (fVar283 * (fVar107 * fVar302 - fVar302 * fVar107) -
                                fVar219 * fVar281) * fVar303 + fVar107 * fVar284;
  fVar147 = fVar194 - fVar126;
  fVar164 = fVar206 - fVar127;
  fVar168 = fVar216 - fVar128;
  fVar302 = fVar245 - fVar145;
  fVar126 = fVar126 + fVar194;
  fVar127 = fVar127 + fVar206;
  fVar128 = fVar128 + fVar216;
  fVar145 = fVar145 + fVar245;
  fVar194 = 1.0 - fVar105;
  local_378 = fVar300 * fVar194 + fVar328 * fVar105;
  fStack_374 = fVar231 * fVar194 + fVar267 * fVar105;
  fStack_370 = fVar237 * fVar194 + fVar279 * fVar105;
  fStack_36c = fVar242 * fVar194 + fVar282 * fVar105;
  local_388 = ((fVar258 - fVar306) * 0.33333334 + fVar300) * fVar194 +
              ((fVar285 - fVar163) * 0.33333334 + fVar328) * fVar105;
  fStack_384 = ((fVar321 - fVar316) * 0.33333334 + fVar231) * fVar194 +
               ((fVar299 - fVar165) * 0.33333334 + fVar267) * fVar105;
  fStack_380 = ((fVar229 - fVar318) * 0.33333334 + fVar237) * fVar194 +
               ((fVar305 - fVar169) * 0.33333334 + fVar279) * fVar105;
  fStack_37c = ((fVar266 - fVar320) * 0.33333334 + fVar242) * fVar194 +
               ((fVar317 - fVar170) * 0.33333334 + fVar282) * fVar105;
  local_3a8 = (fVar246 - (fVar195 - fVar319) * 0.33333334) * fVar194 +
              (fVar147 - (fVar146 - fVar326) * 0.33333334) * fVar105;
  fStack_3a4 = (fVar259 - (fVar205 - fVar327) * 0.33333334) * fVar194 +
               (fVar164 - (fVar76 - fVar230) * 0.33333334) * fVar105;
  fStack_3a0 = (fVar262 - (fVar207 - fVar235) * 0.33333334) * fVar194 +
               (fVar168 - (fVar106 - fVar322) * 0.33333334) * fVar105;
  fStack_39c = (fVar264 - (fVar217 - fVar241) * 0.33333334) * fVar194 +
               (fVar302 - (fVar107 - fVar236) * 0.33333334) * fVar105;
  local_398 = fVar246 * fVar194 + fVar147 * fVar105;
  fStack_394 = fVar259 * fVar194 + fVar164 * fVar105;
  fStack_390 = fVar262 * fVar194 + fVar168 * fVar105;
  fStack_38c = fVar264 * fVar194 + fVar302 * fVar105;
  local_338 = fVar336 * fVar194 + fVar193 * fVar105;
  fStack_334 = fVar343 * fVar194 + fVar280 * fVar105;
  fStack_330 = fVar344 * fVar194 + fVar296 * fVar105;
  fStack_32c = fVar345 * fVar194 + fVar315 * fVar105;
  local_3c8 = ((fVar306 + fVar258) * 0.33333334 + fVar336) * fVar194 +
              ((fVar163 + fVar285) * 0.33333334 + fVar193) * fVar105;
  fStack_3c4 = ((fVar316 + fVar321) * 0.33333334 + fVar343) * fVar194 +
               ((fVar165 + fVar299) * 0.33333334 + fVar280) * fVar105;
  fStack_3c0 = ((fVar318 + fVar229) * 0.33333334 + fVar344) * fVar194 +
               ((fVar169 + fVar305) * 0.33333334 + fVar296) * fVar105;
  fStack_3bc = ((fVar320 + fVar266) * 0.33333334 + fVar345) * fVar194 +
               ((fVar170 + fVar317) * 0.33333334 + fVar315) * fVar105;
  local_3dc.m128[1] =
       (fVar261 - (fVar319 + fVar195) * 0.33333334) * fVar194 +
       (fVar126 - (fVar326 + fVar146) * 0.33333334) * fVar105;
  local_3dc.m128[2] =
       (fVar218 - (fVar327 + fVar205) * 0.33333334) * fVar194 +
       (fVar127 - (fVar230 + fVar76) * 0.33333334) * fVar105;
  local_3dc.m128[3] =
       (fVar234 - (fVar235 + fVar207) * 0.33333334) * fVar194 +
       (fVar128 - (fVar322 + fVar106) * 0.33333334) * fVar105;
  fStack_3cc = (fVar277 - (fVar241 + fVar217) * 0.33333334) * fVar194 +
               (fVar145 - (fVar236 + fVar107) * 0.33333334) * fVar105;
  local_2b8 = fVar194 * fVar261 + fVar105 * fVar126;
  fStack_2b4 = fVar194 * fVar218 + fVar105 * fVar127;
  fStack_2b0 = fVar194 * fVar234 + fVar105 * fVar128;
  fStack_2ac = fVar194 * fVar277 + fVar105 * fVar145;
  fVar146 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar76 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar105 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar106 = (pre->ray_space).vx.field_0.m128[0];
  fVar107 = (pre->ray_space).vx.field_0.m128[1];
  fVar126 = (pre->ray_space).vy.field_0.m128[0];
  fVar127 = (pre->ray_space).vy.field_0.m128[1];
  fVar128 = (pre->ray_space).vz.field_0.m128[0];
  fVar145 = (pre->ray_space).vz.field_0.m128[1];
  local_308 = (local_378 - fVar146) * fVar106 +
              (fStack_374 - fVar76) * fVar126 + (fStack_370 - fVar105) * fVar128;
  fStack_304 = (local_378 - fVar146) * fVar107 +
               (fStack_374 - fVar76) * fVar127 + (fStack_370 - fVar105) * fVar145;
  local_208 = CONCAT44(fStack_304,local_308);
  fVar164 = (local_388 - fVar146) * fVar106 +
            (fStack_384 - fVar76) * fVar126 + (fStack_380 - fVar105) * fVar128;
  fVar165 = (local_388 - fVar146) * fVar107 +
            (fStack_384 - fVar76) * fVar127 + (fStack_380 - fVar105) * fVar145;
  local_218 = CONCAT44(fVar165,fVar164);
  fVar147 = (local_3a8 - fVar146) * fVar106 +
            (fStack_3a4 - fVar76) * fVar126 + (fStack_3a0 - fVar105) * fVar128;
  fVar163 = (local_3a8 - fVar146) * fVar107 +
            (fStack_3a4 - fVar76) * fVar127 + (fStack_3a0 - fVar105) * fVar145;
  local_228 = CONCAT44(fVar163,fVar147);
  fVar168 = (local_398 - fVar146) * fVar106 +
            (fStack_394 - fVar76) * fVar126 + (fStack_390 - fVar105) * fVar128;
  fVar169 = (local_398 - fVar146) * fVar107 +
            (fStack_394 - fVar76) * fVar127 + (fStack_390 - fVar105) * fVar145;
  local_238 = CONCAT44(fVar169,fVar168);
  fStack_300 = (local_338 - fVar146) * fVar106 +
               (fStack_334 - fVar76) * fVar126 + (fStack_330 - fVar105) * fVar128;
  fStack_2fc = (local_338 - fVar146) * fVar107 +
               (fStack_334 - fVar76) * fVar127 + (fStack_330 - fVar105) * fVar145;
  fVar170 = (local_3c8 - fVar146) * fVar106 +
            (fStack_3c4 - fVar76) * fVar126 + (fStack_3c0 - fVar105) * fVar128;
  fVar193 = (local_3c8 - fVar146) * fVar107 +
            (fStack_3c4 - fVar76) * fVar127 + (fStack_3c0 - fVar105) * fVar145;
  local_258 = CONCAT44(fVar193,fVar170);
  fVar194 = (local_3dc.m128[1] - fVar146) * fVar106 +
            (local_3dc.m128[2] - fVar76) * fVar126 + (local_3dc.m128[3] - fVar105) * fVar128;
  fVar195 = (local_3dc.m128[1] - fVar146) * fVar107 +
            (local_3dc.m128[2] - fVar76) * fVar127 + (local_3dc.m128[3] - fVar105) * fVar145;
  local_268 = CONCAT44(fVar195,fVar194);
  fVar106 = (local_2b8 - fVar146) * fVar106 +
            (fStack_2b4 - fVar76) * fVar126 + (fStack_2b0 - fVar105) * fVar128;
  fVar76 = (local_2b8 - fVar146) * fVar107 +
           (fStack_2b4 - fVar76) * fVar127 + (fStack_2b0 - fVar105) * fVar145;
  local_278 = CONCAT44(fVar76,fVar106);
  register0x00001308 = local_258;
  local_318 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar97._8_4_ = fStack_300;
  auVar97._0_8_ = local_208;
  auVar97._12_4_ = fStack_2fc;
  auVar77 = minps(auVar97,_local_318);
  auVar119._8_4_ = fVar194;
  auVar119._0_8_ = local_228;
  auVar119._12_4_ = fVar195;
  auVar130 = minps(auVar119,_local_b8);
  auVar77 = minps(auVar77,auVar130);
  auVar120._4_4_ = fStack_304;
  auVar120._0_4_ = local_308;
  auVar120._8_4_ = fStack_300;
  auVar120._12_4_ = fStack_2fc;
  auVar130 = maxps(auVar120,_local_318);
  auVar131._4_4_ = fVar163;
  auVar131._0_4_ = fVar147;
  auVar131._8_4_ = fVar194;
  auVar131._12_4_ = fVar195;
  auVar132 = maxps(auVar131,_local_b8);
  auVar121 = maxps(auVar130,auVar132);
  auVar25._4_8_ = auVar132._8_8_;
  auVar25._0_4_ = auVar77._4_4_;
  auVar133._0_8_ = auVar25._0_8_ << 0x20;
  auVar133._8_4_ = auVar77._8_4_;
  auVar133._12_4_ = auVar77._12_4_;
  auVar134._8_8_ = auVar77._8_8_;
  auVar134._0_8_ = auVar133._8_8_;
  auVar130 = minps(auVar77,auVar134);
  auVar26._4_8_ = auVar77._8_8_;
  auVar26._0_4_ = auVar121._4_4_;
  auVar135._0_8_ = auVar26._0_8_ << 0x20;
  auVar135._8_4_ = auVar121._8_4_;
  auVar135._12_4_ = auVar121._12_4_;
  auVar136._8_8_ = auVar121._8_8_;
  auVar136._0_8_ = auVar135._8_8_;
  auVar77 = maxps(auVar121,auVar136);
  auVar98._0_8_ = auVar130._0_8_ & 0x7fffffff7fffffff;
  auVar98._8_4_ = auVar130._8_4_ & 0x7fffffff;
  auVar98._12_4_ = auVar130._12_4_ & 0x7fffffff;
  auVar122._0_8_ = auVar77._0_8_ & 0x7fffffff7fffffff;
  auVar122._8_4_ = auVar77._8_4_ & 0x7fffffff;
  auVar122._12_4_ = auVar77._12_4_ & 0x7fffffff;
  auVar77 = maxps(auVar98,auVar122);
  fVar146 = auVar77._4_4_;
  if (auVar77._4_4_ <= auVar77._0_4_) {
    fVar146 = auVar77._0_4_;
  }
  auVar68 = (undefined1  [8])((ulong)uVar70 + 0xf);
  fVar146 = fVar146 * 9.536743e-07;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  local_248 = CONCAT44(fStack_2fc,fStack_300);
  uStack_240 = CONCAT44(fStack_2fc,fStack_300);
  uStack_250 = local_258;
  uStack_260 = local_268;
  uStack_270 = local_278;
  local_148 = fVar146;
  fStack_144 = fVar146;
  fStack_140 = fVar146;
  fStack_13c = fVar146;
  local_158 = -fVar146;
  fStack_154 = -fVar146;
  fStack_150 = -fVar146;
  fStack_14c = -fVar146;
  local_88 = fVar164 - local_308;
  fStack_84 = fVar165 - fStack_304;
  fStack_80 = fVar170 - fStack_300;
  fStack_7c = fVar193 - fStack_2fc;
  local_98 = fVar147 - fVar164;
  fStack_94 = fVar163 - fVar165;
  fStack_90 = fVar194 - fVar170;
  fStack_8c = fVar195 - fVar193;
  local_a8 = fVar168 - fVar147;
  fStack_a4 = fVar169 - fVar163;
  fStack_a0 = fVar106 - fVar194;
  fStack_9c = fVar76 - fVar195;
  local_178 = local_338 - local_378;
  fStack_174 = fStack_334 - fStack_374;
  fStack_170 = fStack_330 - fStack_370;
  fStack_16c = fStack_32c - fStack_36c;
  local_188 = local_3c8 - local_388;
  fStack_184 = fStack_3c4 - fStack_384;
  fStack_180 = fStack_3c0 - fStack_380;
  fStack_17c = fStack_3bc - fStack_37c;
  local_198 = local_3dc.m128[1] - local_3a8;
  fStack_194 = local_3dc.m128[2] - fStack_3a4;
  fStack_190 = local_3dc.m128[3] - fStack_3a0;
  fStack_18c = fStack_3cc - fStack_39c;
  local_1a8 = local_2b8 - local_398;
  fStack_1a4 = fStack_2b4 - fStack_394;
  fStack_1a0 = fStack_2b0 - fStack_390;
  fStack_19c = fStack_2ac - fStack_38c;
  uVar60 = 0;
  local_418 = 0x3f80000000000000;
  local_368 = 0x3f80000000000000;
  uStack_360 = 0;
  local_328 = local_228;
  uStack_320 = local_268;
  do {
    fVar76 = 1.0 - (float)local_418;
    fVar105 = 1.0 - (float)local_418;
    fVar106 = 1.0 - local_418._4_4_;
    fVar107 = 1.0 - local_418._4_4_;
    fVar126 = (float)local_208 * fVar76 + (float)local_248 * (float)local_418;
    fVar168 = local_208._4_4_ * fVar105 + local_248._4_4_ * (float)local_418;
    fVar169 = (float)uStack_200 * fVar106 + (float)uStack_240 * local_418._4_4_;
    fVar170 = uStack_200._4_4_ * fVar107 + uStack_240._4_4_ * local_418._4_4_;
    fVar163 = (float)local_218 * fVar76 + (float)local_258 * (float)local_418;
    fVar206 = local_218._4_4_ * fVar105 + local_258._4_4_ * (float)local_418;
    fVar207 = (float)uStack_210 * fVar106 + (float)uStack_250 * local_418._4_4_;
    fVar216 = uStack_210._4_4_ * fVar107 + uStack_250._4_4_ * local_418._4_4_;
    fVar217 = (float)local_228 * fVar76 + (float)local_268 * (float)local_418;
    fVar245 = local_228._4_4_ * fVar105 + local_268._4_4_ * (float)local_418;
    fVar258 = (float)uStack_220 * fVar106 + (float)uStack_260 * local_418._4_4_;
    fVar261 = uStack_220._4_4_ * fVar107 + uStack_260._4_4_ * local_418._4_4_;
    fVar296 = fVar76 * (float)local_238 + (float)local_418 * (float)local_278;
    fVar299 = fVar105 * local_238._4_4_ + (float)local_418 * local_278._4_4_;
    fVar302 = fVar106 * (float)uStack_230 + local_418._4_4_ * (float)uStack_270;
    fVar305 = fVar107 * uStack_230._4_4_ + local_418._4_4_ * uStack_270._4_4_;
    fVar76 = (local_368._4_4_ - (float)local_368) * 0.11111111;
    fVar321 = (local_368._4_4_ - (float)local_368) * 0.0 + (float)local_368;
    fVar218 = (local_368._4_4_ - (float)local_368) * 0.33333334 + (float)local_368;
    fVar229 = (local_368._4_4_ - (float)local_368) * 0.6666667 + (float)local_368;
    fVar234 = (local_368._4_4_ - (float)local_368) * 1.0 + (float)local_368;
    fVar266 = 1.0 - fVar321;
    fVar277 = 1.0 - fVar218;
    fVar280 = 1.0 - fVar229;
    fVar285 = 1.0 - fVar234;
    fVar127 = fVar163 * fVar266 + fVar217 * fVar321;
    fVar128 = fVar163 * fVar277 + fVar217 * fVar218;
    fVar145 = fVar163 * fVar280 + fVar217 * fVar229;
    fVar147 = fVar163 * fVar285 + fVar217 * fVar234;
    fVar193 = fVar206 * fVar266 + fVar245 * fVar321;
    fVar194 = fVar206 * fVar277 + fVar245 * fVar218;
    fVar195 = fVar206 * fVar280 + fVar245 * fVar229;
    fVar205 = fVar206 * fVar285 + fVar245 * fVar234;
    fVar105 = (fVar126 * fVar266 + fVar163 * fVar321) * fVar266 + fVar321 * fVar127;
    fVar106 = (fVar126 * fVar277 + fVar163 * fVar218) * fVar277 + fVar218 * fVar128;
    fVar107 = (fVar126 * fVar280 + fVar163 * fVar229) * fVar280 + fVar229 * fVar145;
    fVar126 = (fVar126 * fVar285 + fVar163 * fVar234) * fVar285 + fVar234 * fVar147;
    fVar163 = (fVar168 * fVar266 + fVar206 * fVar321) * fVar266 + fVar321 * fVar193;
    fVar164 = (fVar168 * fVar277 + fVar206 * fVar218) * fVar277 + fVar218 * fVar194;
    fVar165 = (fVar168 * fVar280 + fVar206 * fVar229) * fVar280 + fVar229 * fVar195;
    fVar168 = (fVar168 * fVar285 + fVar206 * fVar234) * fVar285 + fVar234 * fVar205;
    fVar127 = fVar127 * fVar266 + (fVar217 * fVar266 + fVar296 * fVar321) * fVar321;
    fVar128 = fVar128 * fVar277 + (fVar217 * fVar277 + fVar296 * fVar218) * fVar218;
    fVar145 = fVar145 * fVar280 + (fVar217 * fVar280 + fVar296 * fVar229) * fVar229;
    fVar147 = fVar147 * fVar285 + (fVar217 * fVar285 + fVar296 * fVar234) * fVar234;
    fVar193 = fVar193 * fVar266 + (fVar245 * fVar266 + fVar299 * fVar321) * fVar321;
    fVar194 = fVar194 * fVar277 + (fVar245 * fVar277 + fVar299 * fVar218) * fVar218;
    fVar195 = fVar195 * fVar280 + (fVar245 * fVar280 + fVar299 * fVar229) * fVar229;
    fVar205 = fVar205 * fVar285 + (fVar245 * fVar285 + fVar299 * fVar234) * fVar234;
    local_2a8 = fVar266 * fVar105 + fVar321 * fVar127;
    fStack_2a4 = fVar277 * fVar106 + fVar218 * fVar128;
    fStack_2a0 = fVar280 * fVar107 + fVar229 * fVar145;
    fStack_29c = fVar285 * fVar126 + fVar234 * fVar147;
    local_298 = fVar266 * fVar163 + fVar321 * fVar193;
    fStack_294 = fVar277 * fVar164 + fVar218 * fVar194;
    fStack_290 = fVar280 * fVar165 + fVar229 * fVar195;
    fStack_28c = fVar285 * fVar168 + fVar234 * fVar205;
    fVar128 = (fVar128 - fVar106) * 3.0 * fVar76;
    fVar107 = (fVar145 - fVar107) * 3.0 * fVar76;
    fVar126 = (fVar147 - fVar126) * 3.0 * fVar76;
    fVar145 = (fVar194 - fVar164) * 3.0 * fVar76;
    fVar147 = (fVar195 - fVar165) * 3.0 * fVar76;
    fVar164 = (fVar205 - fVar168) * 3.0 * fVar76;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_3b8._0_4_ = local_2a8 + (fVar127 - fVar105) * 3.0 * fVar76;
    local_3b8._4_4_ = fStack_2a4 + fVar128;
    uStack_3b0._0_4_ = fStack_2a0 + fVar107;
    uStack_3b0._4_4_ = fStack_29c + fVar126;
    fVar105 = local_298 + (fVar193 - fVar163) * 3.0 * fVar76;
    fVar106 = fStack_294 + fVar145;
    fStack_420 = fStack_290 + fVar147;
    fStack_41c = fStack_28c + fVar164;
    local_288._0_4_ = fStack_2a4 - fVar128;
    local_288._4_4_ = fStack_2a0 - fVar107;
    local_288._8_4_ = fStack_29c - fVar126;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar145;
    local_d8._4_4_ = fStack_290 - fVar147;
    local_d8._8_4_ = fStack_28c - fVar164;
    local_d8._12_4_ = 0;
    fVar107 = fVar207 * fVar266 + fVar258 * fVar321;
    fVar126 = fVar207 * fVar277 + fVar258 * fVar218;
    fVar127 = fVar207 * fVar280 + fVar258 * fVar229;
    fVar128 = fVar207 * fVar285 + fVar258 * fVar234;
    fVar145 = fVar216 * fVar266 + fVar261 * fVar321;
    fVar147 = fVar216 * fVar277 + fVar261 * fVar218;
    fVar163 = fVar216 * fVar280 + fVar261 * fVar229;
    fVar164 = fVar216 * fVar285 + fVar261 * fVar234;
    fVar193 = (fVar169 * fVar266 + fVar207 * fVar321) * fVar266 + fVar321 * fVar107;
    fVar194 = (fVar169 * fVar277 + fVar207 * fVar218) * fVar277 + fVar218 * fVar126;
    fVar195 = (fVar169 * fVar280 + fVar207 * fVar229) * fVar280 + fVar229 * fVar127;
    fVar205 = (fVar169 * fVar285 + fVar207 * fVar234) * fVar285 + fVar234 * fVar128;
    fVar165 = (fVar170 * fVar266 + fVar216 * fVar321) * fVar266 + fVar321 * fVar145;
    fVar168 = (fVar170 * fVar277 + fVar216 * fVar218) * fVar277 + fVar218 * fVar147;
    fVar169 = (fVar170 * fVar280 + fVar216 * fVar229) * fVar280 + fVar229 * fVar163;
    fVar170 = (fVar170 * fVar285 + fVar216 * fVar234) * fVar285 + fVar234 * fVar164;
    fVar107 = fVar107 * fVar266 + (fVar258 * fVar266 + fVar302 * fVar321) * fVar321;
    fVar126 = fVar126 * fVar277 + (fVar258 * fVar277 + fVar302 * fVar218) * fVar218;
    fVar127 = fVar127 * fVar280 + (fVar258 * fVar280 + fVar302 * fVar229) * fVar229;
    fVar128 = fVar128 * fVar285 + (fVar258 * fVar285 + fVar302 * fVar234) * fVar234;
    fVar206 = fVar145 * fVar266 + (fVar261 * fVar266 + fVar305 * fVar321) * fVar321;
    fVar207 = fVar147 * fVar277 + (fVar261 * fVar277 + fVar305 * fVar218) * fVar218;
    fVar216 = fVar163 * fVar280 + (fVar261 * fVar280 + fVar305 * fVar229) * fVar229;
    fVar217 = fVar164 * fVar285 + (fVar261 * fVar285 + fVar305 * fVar234) * fVar234;
    fVar145 = fVar266 * fVar193 + fVar321 * fVar107;
    fVar147 = fVar277 * fVar194 + fVar218 * fVar126;
    fVar163 = fVar280 * fVar195 + fVar229 * fVar127;
    fVar164 = fVar285 * fVar205 + fVar234 * fVar128;
    fVar245 = fVar266 * fVar165 + fVar321 * fVar206;
    fVar258 = fVar277 * fVar168 + fVar218 * fVar207;
    fVar261 = fVar280 * fVar169 + fVar229 * fVar216;
    fVar321 = fVar285 * fVar170 + fVar234 * fVar217;
    fVar126 = (fVar126 - fVar194) * 3.0 * fVar76;
    fVar127 = (fVar127 - fVar195) * 3.0 * fVar76;
    fVar128 = (fVar128 - fVar205) * 3.0 * fVar76;
    fVar168 = (fVar207 - fVar168) * 3.0 * fVar76;
    fVar169 = (fVar216 - fVar169) * 3.0 * fVar76;
    fVar170 = (fVar217 - fVar170) * 3.0 * fVar76;
    local_f8._4_4_ = fVar163;
    local_f8._0_4_ = fVar147;
    local_f8._8_4_ = fVar164;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar261;
    local_118._0_4_ = fVar258;
    local_118._8_4_ = fVar321;
    local_118._12_4_ = 0;
    local_348 = fVar145 + (fVar107 - fVar193) * 3.0 * fVar76;
    fStack_344 = fVar147 + fVar126;
    fStack_340 = fVar163 + fVar127;
    fStack_33c = fVar164 + fVar128;
    local_108 = fVar245 + (fVar206 - fVar165) * 3.0 * fVar76;
    fStack_104 = fVar258 + fVar168;
    fStack_100 = fVar261 + fVar169;
    fStack_fc = fVar321 + fVar170;
    local_138._0_4_ = fVar147 - fVar126;
    local_138._4_4_ = fVar163 - fVar127;
    local_138._8_4_ = fVar164 - fVar128;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar258 - fVar168;
    local_128._4_4_ = fVar261 - fVar169;
    local_128._8_4_ = fVar321 - fVar170;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar128 = (fVar147 - fStack_2a4) + (fVar145 - local_2a8);
    fVar165 = (fVar163 - fStack_2a0) + (fVar147 - fStack_2a4);
    fVar168 = (fVar164 - fStack_29c) + (fVar163 - fStack_2a0);
    fVar169 = (fVar164 - fStack_29c) + 0.0;
    fVar76 = (fVar258 - fStack_294) + (fVar245 - local_298);
    fVar107 = (fVar261 - fStack_290) + (fVar258 - fStack_294);
    fVar126 = (fVar321 - fStack_28c) + (fVar261 - fStack_290);
    fVar127 = (fVar321 - fStack_28c) + 0.0;
    auVar187._0_8_ =
         CONCAT44(fStack_294 * fVar165 - fStack_2a4 * fVar107,
                  local_298 * fVar128 - local_2a8 * fVar76);
    auVar187._8_4_ = fStack_290 * fVar168 - fStack_2a0 * fVar126;
    auVar187._12_4_ = fStack_28c * fVar169 - fStack_29c * fVar127;
    auVar137._0_4_ = fVar105 * fVar128 - (float)local_3b8._0_4_ * fVar76;
    auVar137._4_4_ = fVar106 * fVar165 - (float)local_3b8._4_4_ * fVar107;
    auVar137._8_4_ = fStack_420 * fVar168 - (float)uStack_3b0 * fVar126;
    auVar137._12_4_ = fStack_41c * fVar169 - uStack_3b0._4_4_ * fVar127;
    auVar153._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar165 - fVar107 * local_288._4_4_,
                  local_d8._0_4_ * fVar128 - fVar76 * local_288._0_4_);
    auVar153._8_4_ = local_d8._8_4_ * fVar168 - fVar126 * local_288._8_4_;
    auVar153._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
    auVar337._0_4_ = fVar128 * fStack_294 - fVar76 * fStack_2a4;
    auVar337._4_4_ = fVar165 * fStack_290 - fVar107 * fStack_2a0;
    auVar337._8_4_ = fVar168 * fStack_28c - fVar126 * fStack_29c;
    auVar337._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
    auVar99._0_8_ =
         CONCAT44(fVar258 * fVar165 - fVar147 * fVar107,fVar245 * fVar128 - fVar145 * fVar76);
    auVar99._8_4_ = fVar261 * fVar168 - fVar163 * fVar126;
    auVar99._12_4_ = fVar321 * fVar169 - fVar164 * fVar127;
    auVar293._0_4_ = local_108 * fVar128 - local_348 * fVar76;
    auVar293._4_4_ = fStack_104 * fVar165 - fStack_344 * fVar107;
    auVar293._8_4_ = fStack_100 * fVar168 - fStack_340 * fVar126;
    auVar293._12_4_ = fStack_fc * fVar169 - fStack_33c * fVar127;
    auVar220._0_8_ =
         CONCAT44(local_128._4_4_ * fVar165 - fVar107 * local_138._4_4_,
                  local_128._0_4_ * fVar128 - fVar76 * local_138._0_4_);
    auVar220._8_4_ = local_128._8_4_ * fVar168 - fVar126 * local_138._8_4_;
    auVar220._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
    auVar273._0_4_ = fVar128 * fVar258 - fVar76 * fVar147;
    auVar273._4_4_ = fVar165 * fVar261 - fVar107 * fVar163;
    auVar273._8_4_ = fVar168 * fVar321 - fVar126 * fVar164;
    auVar273._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
    auVar329._8_4_ = auVar187._8_4_;
    auVar329._0_8_ = auVar187._0_8_;
    auVar329._12_4_ = auVar187._12_4_;
    auVar121 = minps(auVar329,auVar137);
    auVar130 = maxps(auVar187,auVar137);
    auVar138._8_4_ = auVar153._8_4_;
    auVar138._0_8_ = auVar153._0_8_;
    auVar138._12_4_ = auVar153._12_4_;
    auVar77 = minps(auVar138,auVar337);
    auVar330 = minps(auVar121,auVar77);
    auVar77 = maxps(auVar153,auVar337);
    auVar132 = maxps(auVar130,auVar77);
    auVar139._8_4_ = auVar99._8_4_;
    auVar139._0_8_ = auVar99._0_8_;
    auVar139._12_4_ = auVar99._12_4_;
    auVar130 = minps(auVar139,auVar293);
    auVar77 = maxps(auVar99,auVar293);
    auVar154._8_4_ = auVar220._8_4_;
    auVar154._0_8_ = auVar220._0_8_;
    auVar154._12_4_ = auVar220._12_4_;
    auVar121 = minps(auVar154,auVar273);
    auVar130 = minps(auVar130,auVar121);
    auVar121 = minps(auVar330,auVar130);
    auVar130 = maxps(auVar220,auVar273);
    auVar77 = maxps(auVar77,auVar130);
    auVar77 = maxps(auVar132,auVar77);
    bVar69 = auVar121._4_4_ <= fStack_144;
    bVar23 = auVar121._8_4_ <= fStack_140;
    bVar24 = auVar121._12_4_ <= fStack_13c;
    auVar57._4_4_ = -(uint)bVar23;
    auVar57._0_4_ = -(uint)bVar69;
    auVar57._8_4_ = -(uint)bVar24;
    auVar57._12_4_ = 0;
    auVar332 = auVar57 << 0x20;
    auVar188._0_4_ =
         -(uint)(local_158 <= auVar77._0_4_ && auVar121._0_4_ <= local_148) & local_168._0_4_;
    auVar188._4_4_ = -(uint)(fStack_154 <= auVar77._4_4_ && bVar69) & local_168._4_4_;
    auVar188._8_4_ = -(uint)(fStack_150 <= auVar77._8_4_ && bVar23) & local_168._8_4_;
    auVar188._12_4_ = -(uint)(fStack_14c <= auVar77._12_4_ && bVar24) & local_168._12_4_;
    iVar63 = movmskps((int)pRVar65,auVar188);
    paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
    if (iVar63 != 0) {
      fVar128 = (fVar147 - fVar145) + (fStack_2a4 - local_2a8);
      fVar165 = (fVar163 - fVar147) + (fStack_2a0 - fStack_2a4);
      fVar168 = (fVar164 - fVar163) + (fStack_29c - fStack_2a0);
      fVar169 = (0.0 - fVar164) + (0.0 - fStack_29c);
      fVar76 = (fVar258 - fVar245) + (fStack_294 - local_298);
      fVar107 = (fVar261 - fVar258) + (fStack_290 - fStack_294);
      fVar126 = (fVar321 - fVar261) + (fStack_28c - fStack_290);
      fVar127 = (0.0 - fVar321) + (0.0 - fStack_28c);
      auVar338._0_8_ =
           CONCAT44(fStack_294 * fVar165 - fStack_2a4 * fVar107,
                    local_298 * fVar128 - local_2a8 * fVar76);
      auVar338._8_4_ = fStack_290 * fVar168 - fStack_2a0 * fVar126;
      auVar338._12_4_ = fStack_28c * fVar169 - fStack_29c * fVar127;
      auVar140._0_4_ = fVar105 * fVar128 - (float)local_3b8._0_4_ * fVar76;
      auVar140._4_4_ = fVar106 * fVar165 - (float)local_3b8._4_4_ * fVar107;
      auVar140._8_4_ = fStack_420 * fVar168 - (float)uStack_3b0 * fVar126;
      auVar140._12_4_ = fStack_41c * fVar169 - uStack_3b0._4_4_ * fVar127;
      auVar332._0_4_ = local_288._0_4_ * fVar76;
      auVar332._4_4_ = local_288._4_4_ * fVar107;
      auVar332._8_4_ = local_288._8_4_ * fVar126;
      auVar332._12_4_ = fVar127 * 0.0;
      auVar213._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar165 - auVar332._4_4_,
                    local_d8._0_4_ * fVar128 - auVar332._0_4_);
      auVar213._8_4_ = local_d8._8_4_ * fVar168 - auVar332._8_4_;
      auVar213._12_4_ = fVar169 * 0.0 - auVar332._12_4_;
      auVar155._0_4_ = fStack_294 * fVar128 - fStack_2a4 * fVar76;
      auVar155._4_4_ = fStack_290 * fVar165 - fStack_2a0 * fVar107;
      auVar155._8_4_ = fStack_28c * fVar168 - fStack_29c * fVar126;
      auVar155._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
      auVar323._0_8_ =
           CONCAT44(fVar258 * fVar165 - fVar147 * fVar107,fVar245 * fVar128 - fVar145 * fVar76);
      auVar323._8_4_ = fVar261 * fVar168 - fVar163 * fVar126;
      auVar323._12_4_ = fVar321 * fVar169 - fVar164 * fVar127;
      auVar166._0_4_ = local_108 * fVar128 - local_348 * fVar76;
      auVar166._4_4_ = fStack_104 * fVar165 - fStack_344 * fVar107;
      auVar166._8_4_ = fStack_100 * fVar168 - fStack_340 * fVar126;
      auVar166._12_4_ = fStack_fc * fVar169 - fStack_33c * fVar127;
      auVar294._0_8_ =
           CONCAT44(local_128._4_4_ * fVar165 - local_138._4_4_ * fVar107,
                    local_128._0_4_ * fVar128 - local_138._0_4_ * fVar76);
      auVar294._8_4_ = local_128._8_4_ * fVar168 - local_138._8_4_ * fVar126;
      auVar294._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
      auVar274._0_4_ = fVar128 * fVar258 - fVar76 * fVar147;
      auVar274._4_4_ = fVar165 * fVar261 - fVar107 * fVar163;
      auVar274._8_4_ = fVar168 * fVar321 - fVar126 * fVar164;
      auVar274._12_4_ = fVar169 * 0.0 - fVar127 * 0.0;
      auVar100._8_4_ = auVar338._8_4_;
      auVar100._0_8_ = auVar338._0_8_;
      auVar100._12_4_ = auVar338._12_4_;
      auVar77 = minps(auVar100,auVar140);
      auVar121 = maxps(auVar338,auVar140);
      auVar141._8_4_ = auVar213._8_4_;
      auVar141._0_8_ = auVar213._0_8_;
      auVar141._12_4_ = auVar213._12_4_;
      auVar130 = minps(auVar141,auVar155);
      auVar77 = minps(auVar77,auVar130);
      auVar130 = maxps(auVar213,auVar155);
      auVar330 = maxps(auVar121,auVar130);
      auVar142._8_4_ = auVar323._8_4_;
      auVar142._0_8_ = auVar323._0_8_;
      auVar142._12_4_ = auVar323._12_4_;
      auVar130 = minps(auVar142,auVar166);
      auVar132 = maxps(auVar323,auVar166);
      auVar156._8_4_ = auVar294._8_4_;
      auVar156._0_8_ = auVar294._0_8_;
      auVar156._12_4_ = auVar294._12_4_;
      auVar121 = minps(auVar156,auVar274);
      auVar130 = minps(auVar130,auVar121);
      auVar77 = minps(auVar77,auVar130);
      auVar130 = maxps(auVar294,auVar274);
      auVar130 = maxps(auVar132,auVar130);
      auVar130 = maxps(auVar330,auVar130);
      auVar339._0_4_ =
           -(uint)(local_158 <= auVar130._0_4_ && auVar77._0_4_ <= local_148) & auVar188._0_4_;
      auVar339._4_4_ =
           -(uint)(fStack_154 <= auVar130._4_4_ && auVar77._4_4_ <= fStack_144) & auVar188._4_4_;
      auVar339._8_4_ =
           -(uint)(fStack_150 <= auVar130._8_4_ && auVar77._8_4_ <= fStack_140) & auVar188._8_4_;
      auVar339._12_4_ =
           -(uint)(fStack_14c <= auVar130._12_4_ && auVar77._12_4_ <= fStack_13c) & auVar188._12_4_;
      uVar73 = movmskps(0,auVar339);
      paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar73;
    }
    if ((uint)paVar61 != 0) {
      auStack_1f8[uVar60] = (uint)paVar61;
      *(undefined8 *)(afStack_78 + uVar60 * 2) = local_368;
      auStack_58[uVar60] = local_418;
      uVar60 = (ulong)((int)uVar60 + 1);
    }
    do {
      if ((int)uVar60 == 0) {
        fVar146 = (ray->super_RayK<1>).tfar;
        auVar125._4_4_ = -(uint)(fStack_1b4 <= fVar146);
        auVar125._0_4_ = -(uint)(local_1b8 <= fVar146);
        auVar125._8_4_ = -(uint)(fStack_1b0 <= fVar146);
        auVar125._12_4_ = -(uint)(fStack_1ac <= fVar146);
        uVar71 = movmskps((int)paVar61,auVar125);
        uVar70 = uVar70 & SUB84(auVar68,0) & uVar71;
        if (uVar70 == 0) {
          return;
        }
        goto LAB_00c0ff37;
      }
      uVar74 = (int)uVar60 - 1;
      uVar62 = (ulong)uVar74;
      uVar73 = auStack_1f8[uVar62];
      local_418 = auStack_58[uVar62];
      uVar5 = 0;
      if (uVar73 != 0) {
        for (; (uVar73 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar73 = uVar73 - 1 & uVar73;
      auStack_1f8[uVar62] = uVar73;
      if (uVar73 == 0) {
        uVar60 = (ulong)uVar74;
      }
      pRVar64 = (RTCIntersectArguments *)(uVar5 + 1);
      pRVar65 = pRVar64;
      if ((long)pRVar64 < 0) {
        pRVar65 = (RTCIntersectArguments *)((ulong)((uint)pRVar64 & 1) | (ulong)pRVar64 >> 1);
      }
      fVar76 = afStack_78[uVar62 * 2];
      fVar105 = *(float *)((long)auStack_58 + uVar62 * 8 + -0x1c);
      fVar106 = fVar76 * (1.0 - (float)uVar5 * 0.33333334) + fVar105 * (float)uVar5 * 0.33333334;
      fVar107 = fVar76 * (1.0 - (float)pRVar64 * 0.33333334) + fVar105 * (float)pRVar64 * 0.33333334
      ;
      fVar126 = fVar76 * 0.0 + fVar105 * 0.0;
      fVar105 = fVar76 * 0.0 + fVar105 * 0.0;
      fVar76 = fVar107 - fVar106;
      local_368 = CONCAT44(fVar107,fVar106);
      uStack_360 = CONCAT44(fVar105,fVar126);
      if (0.16666667 <= fVar76) break;
      fVar127 = (float)local_418;
      fVar128 = (float)((ulong)local_418 >> 0x20);
      fVar145 = 1.0 - fVar127;
      fVar147 = 1.0 - fVar127;
      fVar193 = 1.0 - fVar128;
      fVar194 = 1.0 - fVar128;
      fVar163 = (float)local_208 * fVar145 + (float)local_248 * fVar127;
      fVar164 = local_208._4_4_ * fVar147 + local_248._4_4_ * fVar127;
      fVar165 = (float)uStack_200 * fVar193 + (float)uStack_240 * fVar128;
      fVar168 = uStack_200._4_4_ * fVar194 + uStack_240._4_4_ * fVar128;
      fVar195 = (float)local_218 * fVar145 + (float)local_258 * fVar127;
      fVar205 = local_218._4_4_ * fVar147 + local_258._4_4_ * fVar127;
      fVar206 = (float)uStack_210 * fVar193 + (float)uStack_250 * fVar128;
      fVar207 = uStack_210._4_4_ * fVar194 + uStack_250._4_4_ * fVar128;
      fVar216 = (float)local_228 * fVar145 + (float)local_268 * fVar127;
      fVar245 = local_228._4_4_ * fVar147 + local_268._4_4_ * fVar127;
      fVar261 = (float)uStack_220 * fVar193 + (float)uStack_260 * fVar128;
      fVar218 = uStack_220._4_4_ * fVar194 + uStack_260._4_4_ * fVar128;
      fVar169 = (fVar145 * (float)local_238 + fVar127 * (float)local_278) - fVar216;
      fVar170 = (fVar147 * local_238._4_4_ + fVar127 * local_278._4_4_) - fVar245;
      fVar193 = (fVar193 * (float)uStack_230 + fVar128 * (float)uStack_270) - fVar261;
      fVar194 = (fVar194 * uStack_230._4_4_ + fVar128 * uStack_270._4_4_) - fVar218;
      fVar127 = fVar106 * (fVar216 - fVar195) + fVar195;
      fVar128 = fVar106 * (fVar245 - fVar205) + fVar205;
      fVar145 = fVar106 * (fVar261 - fVar206) + fVar206;
      fVar147 = fVar106 * (fVar218 - fVar207) + fVar207;
      fVar217 = (fVar216 - fVar195) * fVar107 + fVar195;
      fVar258 = (fVar245 - fVar205) * fVar107 + fVar205;
      fVar321 = (fVar261 - fVar206) * fVar107 + fVar206;
      fVar229 = (fVar218 - fVar207) * fVar107 + fVar207;
      fVar234 = fVar106 * (fVar195 - fVar163) + fVar163;
      fVar266 = fVar106 * (fVar205 - fVar164) + fVar164;
      fVar277 = fVar106 * (fVar206 - fVar165) + fVar165;
      fVar280 = fVar106 * (fVar207 - fVar168) + fVar168;
      fVar234 = (fVar127 - fVar234) * fVar106 + fVar234;
      fVar266 = (fVar128 - fVar266) * fVar106 + fVar266;
      fVar277 = (fVar145 - fVar277) * fVar106 + fVar277;
      fVar280 = (fVar147 - fVar280) * fVar106 + fVar280;
      fVar127 = (((fVar106 * fVar169 + fVar216) - fVar127) * fVar106 + fVar127) - fVar234;
      fVar128 = (((fVar106 * fVar170 + fVar245) - fVar128) * fVar106 + fVar128) - fVar266;
      fVar145 = (((fVar106 * fVar193 + fVar261) - fVar145) * fVar106 + fVar145) - fVar277;
      fVar147 = (((fVar106 * fVar194 + fVar218) - fVar147) * fVar106 + fVar147) - fVar280;
      auVar101._0_4_ = fVar106 * fVar127 + fVar234;
      auVar101._4_4_ = fVar106 * fVar128 + fVar266;
      auVar101._8_4_ = fVar106 * fVar145 + fVar277;
      auVar101._12_4_ = fVar106 * fVar147 + fVar280;
      fVar163 = (fVar195 - fVar163) * fVar107 + fVar163;
      fVar164 = (fVar205 - fVar164) * fVar107 + fVar164;
      fVar165 = (fVar206 - fVar165) * fVar107 + fVar165;
      fVar168 = (fVar207 - fVar168) * fVar107 + fVar168;
      fVar163 = (fVar217 - fVar163) * fVar107 + fVar163;
      fVar164 = (fVar258 - fVar164) * fVar107 + fVar164;
      fVar165 = (fVar321 - fVar165) * fVar107 + fVar165;
      fVar168 = (fVar229 - fVar168) * fVar107 + fVar168;
      fVar195 = (((fVar169 * fVar107 + fVar216) - fVar217) * fVar107 + fVar217) - fVar163;
      fVar205 = (((fVar170 * fVar107 + fVar245) - fVar258) * fVar107 + fVar258) - fVar164;
      fVar206 = (((fVar193 * fVar107 + fVar261) - fVar321) * fVar107 + fVar321) - fVar165;
      fVar207 = (((fVar194 * fVar107 + fVar218) - fVar229) * fVar107 + fVar229) - fVar168;
      fVar163 = fVar107 * fVar195 + fVar163;
      fVar164 = fVar107 * fVar205 + fVar164;
      fVar165 = fVar107 * fVar206 + fVar165;
      fVar168 = fVar107 * fVar207 + fVar168;
      fVar216 = fVar76 * 0.33333334;
      fVar169 = fVar127 * 3.0 * fVar216 + auVar101._0_4_;
      fVar170 = fVar128 * 3.0 * fVar216 + auVar101._4_4_;
      fVar193 = fVar145 * 3.0 * fVar216 + auVar101._8_4_;
      fVar194 = fVar147 * 3.0 * fVar216 + auVar101._12_4_;
      fVar195 = fVar163 - fVar216 * fVar195 * 3.0;
      fVar205 = fVar164 - fVar216 * fVar205 * 3.0;
      fVar206 = fVar165 - fVar216 * fVar206 * 3.0;
      fVar207 = fVar168 - fVar216 * fVar207 * 3.0;
      auVar27._4_8_ = auVar332._8_8_;
      auVar27._0_4_ = auVar101._4_4_;
      auVar331._0_8_ = auVar27._0_8_ << 0x20;
      auVar331._8_4_ = auVar101._8_4_;
      auVar331._12_4_ = auVar101._12_4_;
      auVar332._8_8_ = auVar101._8_8_;
      auVar332._0_8_ = auVar331._8_8_;
      fVar258 = (fVar165 - fVar163) + (auVar101._8_4_ - auVar101._0_4_);
      fVar261 = (fVar168 - fVar164) + (auVar101._12_4_ - auVar101._4_4_);
      auVar221._0_4_ = fVar261 * fVar164;
      auVar221._4_4_ = fVar261 * fVar164;
      auVar221._8_4_ = fVar261 * fVar168;
      auVar221._12_4_ = fVar261 * fVar168;
      fVar127 = auVar101._0_4_ * fVar258 + auVar101._4_4_ * fVar261;
      fVar128 = auVar101._8_4_ * fVar258 + auVar101._12_4_ * fVar261;
      fVar321 = fVar169 * fVar258 + fVar170 * fVar261;
      fVar218 = fVar193 * fVar258 + fVar194 * fVar261;
      fVar216 = fVar195 * fVar258 + fVar205 * fVar261;
      auVar252._4_4_ = fVar205 * fVar258 + fVar205 * fVar261;
      auVar252._0_4_ = fVar216;
      fVar217 = fVar206 * fVar258 + fVar207 * fVar261;
      fVar145 = fVar258 * fVar163 + auVar221._0_4_;
      fVar245 = fVar258 * fVar165 + auVar221._8_4_;
      auVar28._4_8_ = auVar221._8_8_;
      auVar28._0_4_ = fVar170 * fVar258 + fVar170 * fVar261;
      auVar222._0_8_ = auVar28._0_8_ << 0x20;
      auVar222._8_4_ = fVar218;
      auVar222._12_4_ = fVar194 * fVar258 + fVar194 * fVar261;
      fVar147 = fVar321;
      if (fVar321 <= fVar127) {
        fVar147 = fVar127;
        fVar127 = fVar321;
      }
      auVar223._8_8_ = auVar222._8_8_;
      auVar223._0_8_ = auVar223._8_8_;
      auVar252._8_4_ = fVar217;
      auVar252._12_4_ = fVar207 * fVar258 + fVar207 * fVar261;
      if (fVar145 <= fVar216) {
        auVar252._0_4_ = fVar145;
      }
      if (auVar252._0_4_ <= fVar127) {
        fVar127 = auVar252._0_4_;
      }
      auVar29._4_8_ = auVar252._8_8_;
      auVar29._0_4_ = fVar258 * fVar164 + auVar221._4_4_;
      auVar253._0_8_ = auVar29._0_8_ << 0x20;
      auVar253._8_4_ = fVar245;
      auVar253._12_4_ = fVar258 * fVar168 + auVar221._12_4_;
      if (fVar145 <= fVar216) {
        fVar145 = fVar216;
      }
      auVar254._8_8_ = auVar253._8_8_;
      auVar254._0_8_ = auVar254._8_8_;
      if (fVar145 <= fVar147) {
        fVar145 = fVar147;
      }
      if (fVar218 <= fVar128) {
        auVar223._0_4_ = fVar128;
        fVar128 = fVar218;
      }
      fVar147 = fVar217;
      if (fVar245 <= fVar217) {
        fVar147 = fVar245;
      }
      if (fVar147 <= fVar128) {
        fVar128 = fVar147;
      }
      if (fVar245 <= fVar217) {
        auVar254._0_4_ = fVar217;
      }
      if (auVar254._0_4_ <= auVar223._0_4_) {
        auVar254._0_4_ = auVar223._0_4_;
      }
      bVar69 = 3 < (uint)uVar60;
      uVar30 = (undefined3)(uVar74 >> 8);
      fVar147 = auVar254._0_4_;
      if ((0.0001 <= fVar127) || (fVar147 <= -0.0001)) {
        if ((-0.0001 < fVar145 && fVar128 < 0.0001) ||
           ((fVar127 < 0.0001 && -0.0001 < fVar145 || (fVar128 < 0.0001 && -0.0001 < fVar147))))
        goto LAB_00c11680;
        bVar23 = true;
        paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar30,bVar69);
        pRVar65 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar65 >> 8),fVar76 < 0.001);
      }
      else {
LAB_00c11680:
        _local_3b8 = auVar332;
        local_418 = CONCAT44(fVar168,fVar165);
        bVar69 = bVar69 || fVar76 < 0.001;
        paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar30,bVar69);
        fVar245 = (float)(~-(uint)(fVar127 < 0.0) & 0x3f800000 | -(uint)(fVar127 < 0.0) & 0xbf800000
                         );
        fVar217 = (float)(~-(uint)(fVar145 < 0.0) & 0x3f800000 | -(uint)(fVar145 < 0.0) & 0xbf800000
                         );
        fVar216 = 0.0;
        if ((fVar245 == fVar217) && (!NAN(fVar245) && !NAN(fVar217))) {
          fVar216 = INFINITY;
        }
        fVar258 = 0.0;
        if ((fVar245 == fVar217) && (!NAN(fVar245) && !NAN(fVar217))) {
          fVar258 = -INFINITY;
        }
        fVar261 = (float)(~-(uint)(fVar128 < 0.0) & 0x3f800000 | -(uint)(fVar128 < 0.0) & 0xbf800000
                         );
        if ((fVar245 != fVar261) || (fVar321 = fVar258, NAN(fVar245) || NAN(fVar261))) {
          if ((fVar128 != fVar127) || (NAN(fVar128) || NAN(fVar127))) {
            fVar128 = -fVar127 / (fVar128 - fVar127);
            fVar128 = (1.0 - fVar128) * 0.0 + fVar128;
            fVar321 = fVar128;
          }
          else {
            fVar128 = INFINITY;
            if ((fVar127 == 0.0) && (fVar128 = INFINITY, !NAN(fVar127))) {
              fVar128 = 0.0;
            }
            fVar321 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar127 == 0.0) & 1) * 4);
          }
          if (fVar128 <= fVar216) {
            fVar216 = fVar128;
          }
          if (fVar321 <= fVar258) {
            fVar321 = fVar258;
          }
        }
        pRVar65 = (RTCIntersectArguments *)(ulong)(fVar147 < 0.0);
        fVar127 = *(float *)(&DAT_01ff1ecc + (long)pRVar65 * 4);
        if ((fVar217 != fVar127) || (fVar128 = fVar321, NAN(fVar217) || NAN(fVar127))) {
          if ((fVar147 != fVar145) || (NAN(fVar147) || NAN(fVar145))) {
            fVar147 = -fVar145 / (fVar147 - fVar145);
            fVar147 = (1.0 - fVar147) * 0.0 + fVar147;
            fVar128 = fVar147;
          }
          else {
            fVar147 = INFINITY;
            if ((fVar145 == 0.0) && (fVar147 = INFINITY, !NAN(fVar145))) {
              fVar147 = 0.0;
            }
            pRVar65 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar145 == 0.0) & 1);
            fVar128 = *(float *)(&DAT_01ff1ec4 + (long)pRVar65 * 4);
          }
          if (fVar147 <= fVar216) {
            fVar216 = fVar147;
          }
          if (fVar128 <= fVar321) {
            fVar128 = fVar321;
          }
        }
        auVar332 = ZEXT816(0x3f80000000000000);
        if ((fVar261 != fVar127) || (NAN(fVar261) || NAN(fVar127))) {
          fVar216 = (float)(~-(uint)(fVar216 < 1.0) & 0x3f800000 |
                           (uint)fVar216 & -(uint)(fVar216 < 1.0));
          fVar128 = (float)(~-(uint)(fVar128 < 1.0) & (uint)fVar128 |
                           -(uint)(fVar128 < 1.0) & 0x3f800000);
        }
        uVar73 = -(uint)(fVar128 < auVar332._4_4_);
        fVar216 = (float)(~-(uint)(fVar216 < 0.0) & (uint)fVar216);
        fVar127 = (float)(~uVar73 & 0x3f800000 | (uint)fVar128 & uVar73);
        bVar23 = true;
        if (fVar216 <= fVar127) {
          fVar216 = fVar216 + -0.1;
          fVar127 = fVar127 + 0.1;
          uVar73 = -(uint)(fVar127 < auVar332._4_4_);
          fVar216 = (float)(~-(uint)(fVar216 < 0.0) & (uint)fVar216);
          fVar229 = (float)(~uVar73 & 0x3f800000 | (uint)fVar127 & uVar73);
          fVar258 = 1.0 - fVar216;
          fVar261 = 1.0 - fVar216;
          fVar321 = 1.0 - fVar229;
          fVar218 = 1.0 - fVar229;
          fVar127 = auVar101._0_4_ * fVar258 + auVar101._8_4_ * fVar216;
          fVar128 = auVar101._4_4_ * fVar261 + auVar101._12_4_ * fVar216;
          fVar145 = auVar101._0_4_ * fVar321 + auVar101._8_4_ * fVar229;
          fVar147 = auVar101._4_4_ * fVar218 + auVar101._12_4_ * fVar229;
          fVar217 = fVar169 * fVar258 + fVar193 * fVar216;
          fVar245 = fVar170 * fVar261 + fVar194 * fVar216;
          fVar169 = fVar169 * fVar321 + fVar193 * fVar229;
          fVar170 = fVar170 * fVar218 + fVar194 * fVar229;
          fVar193 = fVar195 * fVar258 + fVar206 * fVar216;
          fVar194 = fVar205 * fVar261 + fVar207 * fVar216;
          fVar195 = fVar195 * fVar321 + fVar206 * fVar229;
          fVar205 = fVar205 * fVar218 + fVar207 * fVar229;
          fVar206 = fVar258 * fVar163 + fVar165 * fVar216;
          fVar207 = fVar261 * fVar164 + fVar168 * fVar216;
          fVar163 = fVar321 * fVar163 + fStack_420 * fVar229;
          fVar164 = fVar218 * fVar164 + fStack_41c * fVar229;
          fVar315 = fVar165 * (1.0 - fVar216) + fVar168 * fVar216;
          fStack_41c = fVar165 * (1.0 - fVar229) + fVar168 * fVar229;
          fVar76 = 1.0 / fVar76;
          auVar123._0_4_ = fVar163 - fVar206;
          auVar123._4_4_ = fVar164 - fVar207;
          auVar123._8_4_ = fVar163 - fVar163;
          auVar123._12_4_ = fVar164 - fVar164;
          auVar157._0_8_ = CONCAT44(fVar205 - fVar194,fVar195 - fVar193);
          auVar157._8_4_ = fVar195 - fVar195;
          auVar157._12_4_ = fVar205 - fVar205;
          auVar275._0_4_ = fVar169 - fVar217;
          auVar275._4_4_ = fVar170 - fVar245;
          auVar275._8_4_ = fVar169 - fVar169;
          auVar275._12_4_ = fVar170 - fVar170;
          auVar214._0_8_ = CONCAT44((fVar245 - fVar128) * 3.0,(fVar217 - fVar127) * 3.0);
          auVar214._8_4_ = (fVar169 - fVar145) * 3.0;
          auVar214._12_4_ = (fVar170 - fVar147) * 3.0;
          auVar189._0_8_ = CONCAT44((fVar194 - fVar245) * 3.0,(fVar193 - fVar217) * 3.0);
          auVar189._8_4_ = (fVar195 - fVar169) * 3.0;
          auVar189._12_4_ = (fVar205 - fVar170) * 3.0;
          auVar255._0_4_ = (fVar206 - fVar193) * 3.0;
          auVar255._4_4_ = (fVar207 - fVar194) * 3.0;
          auVar255._8_4_ = (fVar163 - fVar195) * 3.0;
          auVar255._12_4_ = (fVar164 - fVar205) * 3.0;
          auVar197._8_4_ = auVar189._8_4_;
          auVar197._0_8_ = auVar189._0_8_;
          auVar197._12_4_ = auVar189._12_4_;
          auVar130 = minps(auVar197,auVar255);
          auVar77 = maxps(auVar189,auVar255);
          auVar224._8_4_ = auVar214._8_4_;
          auVar224._0_8_ = auVar214._0_8_;
          auVar224._12_4_ = auVar214._12_4_;
          auVar132 = minps(auVar224,auVar130);
          auVar121 = maxps(auVar214,auVar77);
          auVar31._4_8_ = auVar77._8_8_;
          auVar31._0_4_ = auVar132._4_4_;
          auVar190._0_8_ = auVar31._0_8_ << 0x20;
          auVar190._8_4_ = auVar132._8_4_;
          auVar190._12_4_ = auVar132._12_4_;
          auVar191._8_8_ = auVar132._8_8_;
          auVar191._0_8_ = auVar190._8_8_;
          auVar32._4_8_ = auVar130._8_8_;
          auVar32._0_4_ = auVar121._4_4_;
          auVar198._0_8_ = auVar32._0_8_ << 0x20;
          auVar198._8_4_ = auVar121._8_4_;
          auVar198._12_4_ = auVar121._12_4_;
          auVar199._8_8_ = auVar121._8_8_;
          auVar199._0_8_ = auVar198._8_8_;
          auVar130 = minps(auVar132,auVar191);
          auVar77 = maxps(auVar121,auVar199);
          fVar229 = auVar130._0_4_ * fVar76;
          fVar234 = auVar130._4_4_ * fVar76;
          fVar266 = auVar130._8_4_ * fVar76;
          fVar277 = auVar130._12_4_ * fVar76;
          fVar195 = fVar76 * auVar77._0_4_;
          fVar206 = fVar76 * auVar77._4_4_;
          fVar216 = fVar76 * auVar77._8_4_;
          fVar76 = fVar76 * auVar77._12_4_;
          fVar321 = 1.0 / (fStack_41c - fVar315);
          auVar143._0_8_ = CONCAT44(fVar147 - fVar128,fVar145 - fVar127);
          auVar143._8_4_ = fVar145 - fVar145;
          auVar143._12_4_ = fVar147 - fVar147;
          auVar200._8_4_ = auVar143._8_4_;
          auVar200._0_8_ = auVar143._0_8_;
          auVar200._12_4_ = auVar143._12_4_;
          auVar121 = minps(auVar200,auVar275);
          auVar130 = maxps(auVar143,auVar275);
          auVar102._8_4_ = auVar157._8_4_;
          auVar102._0_8_ = auVar157._0_8_;
          auVar102._12_4_ = auVar157._12_4_;
          auVar77 = minps(auVar102,auVar123);
          auVar121 = minps(auVar121,auVar77);
          auVar77 = maxps(auVar157,auVar123);
          auVar77 = maxps(auVar130,auVar77);
          fVar258 = auVar121._0_4_ * fVar321;
          fVar261 = auVar121._4_4_ * fVar321;
          fVar218 = fVar321 * auVar77._0_4_;
          fVar321 = fVar321 * auVar77._4_4_;
          local_418 = CONCAT44(fStack_41c,fVar315);
          auVar192._4_4_ = fStack_41c;
          auVar192._0_4_ = fVar107;
          auVar192._8_4_ = fVar126;
          auVar192._12_4_ = fVar105;
          fVar127 = (fVar106 + fVar107) * 0.5;
          fVar128 = (fVar315 + fStack_41c) * 0.5;
          fVar145 = (fVar107 + fVar126) * 0.0;
          fVar147 = (fStack_41c + fVar105) * 0.0;
          fVar163 = local_88 * fVar127 + local_308;
          fVar165 = fStack_84 * fVar127 + fStack_304;
          fVar164 = fStack_80 * fVar127 + fStack_300;
          fVar168 = fStack_7c * fVar127 + fStack_2fc;
          fVar169 = local_98 * fVar127 + (float)local_318._0_4_;
          fVar170 = fStack_94 * fVar127 + (float)local_318._4_4_;
          fVar193 = fStack_90 * fVar127 + fStack_310;
          fVar194 = fStack_8c * fVar127 + fStack_30c;
          fVar163 = (fVar169 - fVar163) * fVar127 + fVar163;
          fVar165 = (fVar170 - fVar165) * fVar127 + fVar165;
          fVar164 = (fVar193 - fVar164) * fVar127 + fVar164;
          fVar168 = (fVar194 - fVar168) * fVar127 + fVar168;
          fVar169 = (((local_a8 * fVar127 + (float)local_328) - fVar169) * fVar127 + fVar169) -
                    fVar163;
          fVar170 = (((fStack_a4 * fVar127 + local_328._4_4_) - fVar170) * fVar127 + fVar170) -
                    fVar165;
          fVar193 = (((fStack_a0 * fVar127 + (float)uStack_320) - fVar193) * fVar127 + fVar193) -
                    fVar164;
          fVar194 = (((fStack_9c * fVar127 + uStack_320._4_4_) - fVar194) * fVar127 + fVar194) -
                    fVar168;
          fVar163 = fVar127 * fVar169 + fVar163;
          fVar165 = fVar127 * fVar170 + fVar165;
          fVar169 = fVar169 * 3.0;
          fVar170 = fVar170 * 3.0;
          fVar164 = (fVar127 * fVar193 + fVar164) - fVar163;
          fVar168 = (fVar127 * fVar194 + fVar168) - fVar165;
          fVar169 = (fVar193 * 3.0 - fVar169) * fVar128 + fVar169;
          fVar170 = (fVar194 * 3.0 - fVar170) * fVar128 + fVar170;
          auVar124._0_8_ = CONCAT44(fVar169,fVar164) ^ 0x80000000;
          auVar124._8_4_ = fVar169;
          auVar124._12_4_ = fVar169;
          fVar280 = fVar106 - fVar127;
          fVar285 = fVar315 - fVar128;
          fVar296 = fVar107 - fVar145;
          fVar299 = fStack_41c - fVar147;
          fVar302 = fVar107 - fVar127;
          fVar305 = fStack_41c - fVar128;
          fVar126 = fVar126 - fVar145;
          fVar105 = fVar105 - fVar147;
          fVar163 = fVar164 * fVar128 + fVar163;
          fVar165 = fVar168 * fVar128 + fVar165;
          auVar144._0_8_ = CONCAT44(fVar170,fVar168) ^ 0x8000000000000000;
          auVar144._8_4_ = -fVar170;
          auVar144._12_4_ = -fVar170;
          auVar312._0_4_ = fVar168 * fVar169 - fVar170 * fVar164;
          auVar312._4_4_ = auVar312._0_4_;
          auVar312._8_4_ = auVar312._0_4_;
          auVar312._12_4_ = auVar312._0_4_;
          auVar130 = divps(auVar144,auVar312);
          auVar77 = divps(auVar124,auVar312);
          fVar169 = auVar130._0_4_;
          fVar170 = auVar130._4_4_;
          fVar164 = auVar77._0_4_;
          fVar168 = auVar77._4_4_;
          fVar127 = fVar127 - (fVar165 * fVar164 + fVar163 * fVar169);
          fVar145 = fVar128 - (fVar165 * fVar168 + fVar163 * fVar170);
          fVar147 = fVar128 - (fVar165 * auVar77._8_4_ + fVar163 * auVar130._8_4_);
          fVar128 = fVar128 - (fVar165 * auVar77._12_4_ + fVar163 * auVar130._12_4_);
          auVar333._0_8_ = CONCAT44(fVar170 * fVar258,fVar170 * fVar229);
          auVar333._8_4_ = fVar170 * fVar234;
          auVar333._12_4_ = fVar170 * fVar261;
          auVar256._0_4_ = fVar170 * fVar195;
          auVar256._4_4_ = fVar170 * fVar218;
          auVar256._8_4_ = fVar170 * fVar206;
          auVar256._12_4_ = fVar170 * fVar321;
          auVar340._8_4_ = auVar333._8_4_;
          auVar340._0_8_ = auVar333._0_8_;
          auVar340._12_4_ = auVar333._12_4_;
          auVar132 = minps(auVar340,auVar256);
          auVar130 = maxps(auVar256,auVar333);
          auVar158._0_8_ = CONCAT44(fVar168 * fVar261,fVar168 * fVar234);
          auVar158._8_4_ = fVar168 * fVar266;
          auVar158._12_4_ = fVar168 * fVar277;
          auVar334._0_4_ = fVar168 * fVar206;
          auVar334._4_4_ = fVar168 * fVar321;
          auVar334._8_4_ = fVar168 * fVar216;
          auVar334._12_4_ = fVar168 * fVar76;
          auVar225._8_4_ = auVar158._8_4_;
          auVar225._0_8_ = auVar158._0_8_;
          auVar225._12_4_ = auVar158._12_4_;
          auVar77 = minps(auVar225,auVar334);
          auVar121 = maxps(auVar334,auVar158);
          fVar163 = 0.0 - (auVar121._0_4_ + auVar130._0_4_);
          fVar165 = 1.0 - (auVar121._4_4_ + auVar130._4_4_);
          fVar193 = 0.0 - (auVar121._8_4_ + auVar130._8_4_);
          fVar194 = 0.0 - (auVar121._12_4_ + auVar130._12_4_);
          fVar205 = 0.0 - (auVar77._0_4_ + auVar132._0_4_);
          fVar207 = 1.0 - (auVar77._4_4_ + auVar132._4_4_);
          fVar217 = 0.0 - (auVar77._8_4_ + auVar132._8_4_);
          fVar245 = 0.0 - (auVar77._12_4_ + auVar132._12_4_);
          auVar257._0_8_ = CONCAT44(fVar285 * fVar165,fVar280 * fVar163);
          auVar257._8_4_ = fVar296 * fVar193;
          auVar257._12_4_ = fVar299 * fVar194;
          auVar313._0_8_ = CONCAT44(fVar258 * fVar169,fVar229 * fVar169);
          auVar313._8_4_ = fVar234 * fVar169;
          auVar313._12_4_ = fVar261 * fVar169;
          auVar226._0_4_ = fVar169 * fVar195;
          auVar226._4_4_ = fVar169 * fVar218;
          auVar226._8_4_ = fVar169 * fVar206;
          auVar226._12_4_ = fVar169 * fVar321;
          auVar324._8_4_ = auVar313._8_4_;
          auVar324._0_8_ = auVar313._0_8_;
          auVar324._12_4_ = auVar313._12_4_;
          auVar130 = minps(auVar324,auVar226);
          auVar77 = maxps(auVar226,auVar313);
          auVar201._0_8_ = CONCAT44(fVar261 * fVar164,fVar234 * fVar164);
          auVar201._8_4_ = fVar266 * fVar164;
          auVar201._12_4_ = fVar277 * fVar164;
          auVar335._0_4_ = fVar164 * fVar206;
          auVar335._4_4_ = fVar164 * fVar321;
          auVar335._8_4_ = fVar164 * fVar216;
          auVar335._12_4_ = fVar164 * fVar76;
          auVar341._8_4_ = auVar201._8_4_;
          auVar341._0_8_ = auVar201._0_8_;
          auVar341._12_4_ = auVar201._12_4_;
          auVar132 = minps(auVar341,auVar335);
          auVar314._0_4_ = fVar280 * fVar205;
          auVar314._4_4_ = fVar285 * fVar207;
          auVar314._8_4_ = fVar296 * fVar217;
          auVar314._12_4_ = fVar299 * fVar245;
          auVar159._0_8_ = CONCAT44(fVar165 * fVar305,fVar163 * fVar302);
          auVar159._8_4_ = fVar193 * fVar126;
          auVar159._12_4_ = fVar194 * fVar105;
          auVar167._0_4_ = fVar205 * fVar302;
          auVar167._4_4_ = fVar207 * fVar305;
          auVar167._8_4_ = fVar217 * fVar126;
          auVar167._12_4_ = fVar245 * fVar105;
          auVar121 = maxps(auVar335,auVar201);
          auVar332._0_4_ = auVar121._0_4_ + auVar77._0_4_;
          auVar332._4_4_ = auVar121._4_4_ + auVar77._4_4_;
          auVar332._8_4_ = auVar121._8_4_ + auVar77._8_4_;
          auVar332._12_4_ = auVar121._12_4_ + auVar77._12_4_;
          fVar76 = 1.0 - (auVar132._0_4_ + auVar130._0_4_);
          fVar163 = 0.0 - (auVar132._4_4_ + auVar130._4_4_);
          fVar165 = 0.0 - (auVar132._8_4_ + auVar130._8_4_);
          fVar193 = 0.0 - (auVar132._12_4_ + auVar130._12_4_);
          auVar227._0_8_ =
               CONCAT44(fVar285 * (0.0 - auVar332._4_4_),fVar280 * (1.0 - auVar332._0_4_));
          auVar227._8_4_ = fVar296 * (0.0 - auVar332._8_4_);
          auVar227._12_4_ = fVar299 * (0.0 - auVar332._12_4_);
          auVar276._0_4_ = fVar280 * fVar76;
          auVar276._4_4_ = fVar285 * fVar163;
          auVar276._8_4_ = fVar296 * fVar165;
          auVar276._12_4_ = fVar299 * fVar193;
          auVar202._0_8_ =
               CONCAT44((0.0 - auVar332._4_4_) * fVar305,(1.0 - auVar332._0_4_) * fVar302);
          auVar202._8_4_ = (0.0 - auVar332._8_4_) * fVar126;
          auVar202._12_4_ = (0.0 - auVar332._12_4_) * fVar105;
          auVar215._0_4_ = fVar76 * fVar302;
          auVar215._4_4_ = fVar163 * fVar305;
          auVar215._8_4_ = fVar165 * fVar126;
          auVar215._12_4_ = fVar193 * fVar105;
          auVar295._8_4_ = auVar227._8_4_;
          auVar295._0_8_ = auVar227._0_8_;
          auVar295._12_4_ = auVar227._12_4_;
          auVar77 = minps(auVar295,auVar276);
          auVar325._8_4_ = auVar202._8_4_;
          auVar325._0_8_ = auVar202._0_8_;
          auVar325._12_4_ = auVar202._12_4_;
          auVar130 = minps(auVar325,auVar215);
          auVar132 = minps(auVar77,auVar130);
          auVar130 = maxps(auVar276,auVar227);
          auVar77 = maxps(auVar215,auVar202);
          auVar121 = maxps(auVar77,auVar130);
          auVar203._8_4_ = auVar257._8_4_;
          auVar203._0_8_ = auVar257._0_8_;
          auVar203._12_4_ = auVar257._12_4_;
          auVar77 = minps(auVar203,auVar314);
          auVar228._8_4_ = auVar159._8_4_;
          auVar228._0_8_ = auVar159._0_8_;
          auVar228._12_4_ = auVar159._12_4_;
          auVar130 = minps(auVar228,auVar167);
          auVar130 = minps(auVar77,auVar130);
          auVar330 = maxps(auVar314,auVar257);
          auVar77 = maxps(auVar167,auVar159);
          auVar77 = maxps(auVar77,auVar330);
          auVar204._0_4_ = auVar132._4_4_ + auVar132._0_4_ + fVar127;
          auVar204._4_4_ = auVar130._4_4_ + auVar130._0_4_ + fVar145;
          auVar204._8_4_ = auVar132._8_4_ + auVar132._4_4_ + fVar147;
          auVar204._12_4_ = auVar132._12_4_ + auVar130._4_4_ + fVar128;
          fVar76 = auVar121._4_4_ + auVar121._0_4_ + fVar127;
          fVar105 = auVar77._4_4_ + auVar77._0_4_ + fVar145;
          auVar160._4_4_ = fVar105;
          auVar160._0_4_ = fVar76;
          auVar34._4_4_ = fVar315;
          auVar34._0_4_ = fVar106;
          auVar34._8_4_ = fVar107;
          auVar34._12_4_ = fStack_41c;
          auVar130 = maxps(auVar34,auVar204);
          auVar160._8_4_ = auVar121._8_4_ + auVar121._4_4_ + fVar147;
          auVar160._12_4_ = auVar121._12_4_ + auVar77._4_4_ + fVar128;
          auVar77 = minps(auVar160,auVar192);
          iVar63 = -(uint)(auVar77._0_4_ < auVar130._0_4_);
          iVar72 = -(uint)(auVar77._4_4_ < auVar130._4_4_);
          auVar162._4_4_ = iVar72;
          auVar162._0_4_ = iVar63;
          auVar162._8_4_ = iVar72;
          auVar162._12_4_ = iVar72;
          auVar161._8_8_ = auVar162._8_8_;
          auVar161._4_4_ = iVar63;
          auVar161._0_4_ = iVar63;
          uVar73 = movmskpd((int)pRVar65,auVar161);
          pRVar65 = (RTCIntersectArguments *)(ulong)uVar73;
          fStack_420 = fVar107;
          if (uVar73 == 0) {
            pRVar65 = (RTCIntersectArguments *)0x0;
            if (auVar204._0_4_ <= fVar106) {
              auVar332._0_12_ = ZEXT812(0x40400000);
              auVar332._12_4_ = 0.0;
              auVar342._4_4_ = fStack_304;
              auVar342._0_4_ = local_308;
              auVar342._8_4_ = fStack_300;
              auVar342._12_4_ = fStack_2fc;
            }
            else {
              auVar332._0_12_ = ZEXT812(0x40400000);
              auVar332._12_4_ = 0.0;
              auVar342._4_4_ = fStack_304;
              auVar342._0_4_ = local_308;
              auVar342._8_4_ = fStack_300;
              auVar342._12_4_ = fStack_2fc;
              if (fVar76 < fVar107) {
                iVar63 = -(uint)(fVar105 < fStack_41c);
                pRVar65 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar63 >> 8),
                                          (byte)iVar63 & fVar315 < auVar204._4_4_);
              }
            }
            bVar58 = bVar69 | (byte)pRVar65;
            if (bVar58 == 1) {
              paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
              do {
                fVar105 = 1.0 - fVar127;
                fVar126 = fVar127 * fVar127 * fVar127;
                fVar147 = auVar332._0_4_;
                fVar107 = fVar127 * fVar127 * fVar147 * fVar105;
                fVar76 = fVar105 * fVar105 * fVar105;
                fVar128 = fVar127 * fVar147 * fVar105 * fVar105;
                fVar105 = fVar76 * auVar342._0_4_ +
                          fVar128 * (float)local_318._0_4_ +
                          fVar107 * (float)local_328 + fVar126 * (float)local_b8._0_4_;
                fVar106 = fVar76 * auVar342._4_4_ +
                          fVar128 * (float)local_318._4_4_ +
                          fVar107 * local_328._4_4_ + fVar126 * (float)local_b8._4_4_;
                fVar105 = ((fVar76 * auVar342._8_4_ +
                           fVar128 * fStack_310 + fVar107 * (float)uStack_320 + fVar126 * fStack_b0)
                          - fVar105) * fVar145 + fVar105;
                fVar106 = ((fVar76 * auVar342._12_4_ +
                           fVar128 * fStack_30c + fVar107 * uStack_320._4_4_ + fVar126 * fStack_ac)
                          - fVar106) * fVar145 + fVar106;
                fVar127 = fVar127 - (fVar106 * fVar164 + fVar105 * fVar169);
                fVar145 = fVar145 - (fVar106 * fVar168 + fVar105 * fVar170);
                fVar76 = ABS(fVar106);
                if (ABS(fVar106) <= ABS(fVar105)) {
                  fVar76 = ABS(fVar105);
                }
                if (fVar76 < fVar146) {
                  if ((((0.0 <= fVar127) && (fVar127 <= 1.0)) && (0.0 <= fVar145)) &&
                     (fVar145 <= 1.0)) {
                    fVar76 = (pre->ray_space).vx.field_0.m128[2];
                    fVar105 = (pre->ray_space).vy.field_0.m128[2];
                    fVar106 = (pre->ray_space).vz.field_0.m128[2];
                    fVar107 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fVar126 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar128 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fVar169 = 1.0 - fVar145;
                    fVar168 = 1.0 - fVar127;
                    fVar163 = fVar168 * fVar168 * fVar168;
                    fVar164 = fVar127 * fVar147 * fVar168 * fVar168;
                    fVar165 = fVar127 * fVar127 * fVar127;
                    fVar147 = fVar127 * fVar127 * fVar147 * fVar168;
                    fVar76 = (((fStack_370 - fVar128) * fVar106 +
                              (fStack_374 - fVar126) * fVar105 + (local_378 - fVar107) * fVar76) *
                              fVar169 +
                             ((fStack_330 - fVar128) * fVar106 +
                             (fStack_334 - fVar126) * fVar105 + (local_338 - fVar107) * fVar76) *
                             fVar145) * fVar163 +
                             (((fStack_380 - fVar128) * fVar106 +
                              (fStack_384 - fVar126) * fVar105 + (local_388 - fVar107) * fVar76) *
                              fVar169 +
                             ((fStack_3c0 - fVar128) * fVar106 +
                             (fStack_3c4 - fVar126) * fVar105 + (local_3c8 - fVar107) * fVar76) *
                             fVar145) * fVar164 +
                             (((fStack_3a0 - fVar128) * fVar106 +
                              (fStack_3a4 - fVar126) * fVar105 + (local_3a8 - fVar107) * fVar76) *
                              fVar169 +
                             ((local_3dc.m128[3] - fVar128) * fVar106 +
                             (local_3dc.m128[2] - fVar126) * fVar105 +
                             (local_3dc.m128[1] - fVar107) * fVar76) * fVar145) * fVar147 +
                             (fVar169 * ((fStack_390 - fVar128) * fVar106 +
                                        (fStack_394 - fVar126) * fVar105 +
                                        (local_398 - fVar107) * fVar76) +
                             ((fStack_2b0 - fVar128) * fVar106 +
                             (fStack_2b4 - fVar126) * fVar105 + (local_2b8 - fVar107) * fVar76) *
                             fVar145) * fVar165;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar76) &&
                       (fVar105 = (ray->super_RayK<1>).tfar, fVar76 <= fVar105)) {
                      fVar128 = 1.0 - fVar145;
                      fVar169 = 1.0 - fVar145;
                      fVar170 = 1.0 - fVar145;
                      fVar106 = local_388 * fVar128 + local_3c8 * fVar145;
                      fVar107 = fStack_384 * fVar169 + fStack_3c4 * fVar145;
                      fVar126 = fStack_380 * fVar170 + fStack_3c0 * fVar145;
                      fVar193 = local_3a8 * fVar128 + local_3dc.m128[1] * fVar145;
                      fVar195 = fStack_3a4 * fVar169 + local_3dc.m128[2] * fVar145;
                      fVar206 = fStack_3a0 * fVar170 + local_3dc.m128[3] * fVar145;
                      fVar194 = fVar193 - fVar106;
                      fVar205 = fVar195 - fVar107;
                      fVar207 = fVar206 - fVar126;
                      fVar106 = (((fVar106 - (local_378 * fVar128 + local_338 * fVar145)) * fVar168
                                 + fVar127 * fVar194) * fVar168 +
                                (fVar194 * fVar168 +
                                ((fVar128 * local_398 + fVar145 * local_2b8) - fVar193) * fVar127) *
                                fVar127) * 3.0;
                      fVar107 = (((fVar107 - (fStack_374 * fVar169 + fStack_334 * fVar145)) *
                                  fVar168 + fVar127 * fVar205) * fVar168 +
                                (fVar205 * fVar168 +
                                ((fVar169 * fStack_394 + fVar145 * fStack_2b4) - fVar195) * fVar127)
                                * fVar127) * 3.0;
                      fVar126 = (((fVar126 - (fStack_370 * fVar170 + fStack_330 * fVar145)) *
                                  fVar168 + fVar127 * fVar207) * fVar168 +
                                (fVar207 * fVar168 +
                                ((fVar170 * fStack_390 + fVar145 * fStack_2b0) - fVar206) * fVar127)
                                * fVar127) * 3.0;
                      pGVar15 = (context->scene->geometries).items[uVar71].ptr;
                      uVar73 = (ray->super_RayK<1>).mask;
                      paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar73;
                      pRVar65 = (RTCIntersectArguments *)context;
                      if ((pGVar15->mask & uVar73) != 0) {
                        fVar168 = fVar163 * local_178 +
                                  fVar164 * local_188 + fVar147 * local_198 + fVar165 * local_1a8;
                        fVar169 = fVar163 * fStack_174 +
                                  fVar164 * fStack_184 + fVar147 * fStack_194 + fVar165 * fStack_1a4
                        ;
                        fVar147 = fVar163 * fStack_170 +
                                  fVar164 * fStack_180 + fVar147 * fStack_190 + fVar165 * fStack_1a0
                        ;
                        fVar128 = fVar169 * fVar106 - fVar107 * fVar168;
                        fVar107 = fVar147 * fVar107 - fVar126 * fVar169;
                        fVar106 = fVar168 * fVar126 - fVar106 * fVar147;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar76;
                          *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar106,fVar107);
                          (ray->Ng).field_0.field_0.z = fVar128;
                          ray->u = fVar127;
                          ray->v = fVar145;
                          ray->primID = (uint)local_350;
                          ray->geomID = uVar71;
                          ray->instID[0] = context->user->instID[0];
                          uVar73 = context->user->instPrimID[0];
                          ray->instPrimID[0] = uVar73;
                          paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar73;
                        }
                        else {
                          local_1e8 = CONCAT44(fVar106,fVar107);
                          local_1e0 = fVar128;
                          local_1dc = fVar127;
                          fStack_1d8 = fVar145;
                          local_1d4 = (uint)local_350;
                          local_1d0 = uVar71;
                          local_1cc = context->user->instID[0];
                          pRVar65 = (RTCIntersectArguments *)(ulong)local_1cc;
                          local_1c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar76;
                          local_3dc.m128[0] = -NAN;
                          local_2e8.valid = (int *)&local_3dc;
                          local_2e8.geometryUserPtr = pGVar15->userPtr;
                          local_2e8.context = context->user;
                          local_2e8.ray = (RTCRayN *)ray;
                          local_2e8.hit = (RTCHitN *)&local_1e8;
                          local_2e8.N = 1;
                          if (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c12374:
                            pRVar65 = context->args;
                            if ((RTCIntersectArguments *)pRVar65->filter !=
                                (RTCIntersectArguments *)0x0) {
                              if ((((ulong)*(Scene **)&pRVar65->flags & 2) != 0) ||
                                 (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                                (*(code *)pRVar65->filter)(&local_2e8);
                              }
                              if (*(float *)local_2e8.valid == 0.0) goto LAB_00c12410;
                            }
                            *(float *)((long)local_2e8.ray + 0x30) = *(float *)local_2e8.hit;
                            *(float *)((long)local_2e8.ray + 0x34) = *(float *)(local_2e8.hit + 4);
                            *(float *)((long)local_2e8.ray + 0x38) = *(float *)(local_2e8.hit + 8);
                            *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc)
                            ;
                            *(float *)((long)local_2e8.ray + 0x40) =
                                 *(float *)(local_2e8.hit + 0x10);
                            *(float *)((long)local_2e8.ray + 0x44) =
                                 *(float *)(local_2e8.hit + 0x14);
                            *(float *)((long)local_2e8.ray + 0x48) =
                                 *(float *)(local_2e8.hit + 0x18);
                            *(float *)((long)local_2e8.ray + 0x4c) =
                                 *(float *)(local_2e8.hit + 0x1c);
                            pRVar65 = (RTCIntersectArguments *)
                                      (ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                            *(float *)((long)local_2e8.ray + 0x50) =
                                 *(float *)(local_2e8.hit + 0x20);
                            paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.ray;
                          }
                          else {
                            uStack_3b0 = auVar101._8_8_;
                            local_3b8 = auVar68;
                            (*pGVar15->intersectionFilterN)(&local_2e8);
                            auVar68 = local_3b8;
                            if (*(float *)local_2e8.valid != 0.0) goto LAB_00c12374;
LAB_00c12410:
                            (ray->super_RayK<1>).tfar = fVar105;
                            paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.valid;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar61 + -1);
              } while (paVar61 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
            }
            else {
              bVar23 = false;
              paVar61 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar30,bVar58);
            }
          }
        }
      }
    } while (bVar23);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }